

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx512::CurveNiMBIntersector1<8>::
     intersect_t<embree::avx512::RibbonCurve1Intersector1<embree::BSplineCurveT,8>,embree::avx512::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  __int_type_conflict _Var14;
  RTCFilterFunctionN p_Var15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  ulong uVar22;
  undefined8 uVar23;
  uint uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  byte bVar73;
  uint uVar74;
  uint uVar75;
  long lVar76;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar86;
  undefined1 auVar92 [16];
  long lVar77;
  long lVar78;
  Geometry *pGVar79;
  ulong uVar80;
  long lVar81;
  byte bVar82;
  uint uVar83;
  ulong uVar84;
  float fVar85;
  float fVar139;
  float fVar141;
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar91 [16];
  float fVar140;
  float fVar142;
  float fVar144;
  float fVar145;
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  float fVar143;
  float fVar146;
  float fVar147;
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar149 [16];
  undefined4 uVar148;
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined8 uVar158;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  float fVar163;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  float fVar174;
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  float fVar195;
  float fVar196;
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [16];
  undefined1 auVar205 [32];
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  float fVar208;
  float fVar209;
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [64];
  undefined1 auVar213 [64];
  undefined1 auVar214 [64];
  undefined1 auVar215 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  int local_54c;
  long local_548;
  RayHit *local_540;
  ulong local_538;
  ulong local_530;
  ulong local_528;
  Primitive *local_520;
  Precalculations *local_518;
  RTCFilterFunctionNArguments local_510;
  undefined1 local_4e0 [8];
  undefined8 uStack_4d8;
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined8 local_4a0;
  undefined4 local_498;
  float local_494;
  undefined4 local_490;
  undefined4 local_48c;
  undefined4 local_488;
  uint local_484;
  uint local_480;
  Geometry *local_468;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined4 uStack_384;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined4 local_240;
  int local_23c;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  float local_1e0 [4];
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  local_518 = pre;
  uVar84 = (ulong)(byte)prim[1];
  lVar81 = uVar84 * 0x25;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar84 * 4 + 6);
  auVar105 = vpmovsxbd_avx2(auVar88);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar84 * 5 + 6);
  auVar109 = vpmovsxbd_avx2(auVar87);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar84 * 6 + 6);
  auVar102 = vpmovsxbd_avx2(auVar92);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar84 * 0xf + 6);
  auVar107 = vpmovsxbd_avx2(auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)(byte)prim[1] * 0x10 + 6);
  auVar110 = vpmovsxbd_avx2(auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar84 * 0x11 + 6);
  auVar106 = vpmovsxbd_avx2(auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar84 * 0x1a + 6);
  auVar108 = vpmovsxbd_avx2(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar84 * 0x1b + 6);
  auVar103 = vpmovsxbd_avx2(auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar84 * 0x1c + 6);
  auVar104 = vpmovsxbd_avx2(auVar12);
  fVar163 = *(float *)(prim + lVar81 + 0x12);
  auVar88 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + lVar81 + 6));
  fVar195 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar81 + 0x16)) *
            *(float *)(prim + lVar81 + 0x1a);
  auVar111 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar84 * 7 + 6));
  auVar112 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar84 * 0xb + 6));
  auVar113 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar84 * 9 + 6));
  auVar93 = vpbroadcastd_avx512vl();
  fVar209 = fVar163 * auVar88._0_4_;
  fVar208 = fVar163 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar94 = vcvtdq2ps_avx512vl(auVar109);
  auVar95 = vcvtdq2ps_avx512vl(auVar102);
  auVar96 = vcvtdq2ps_avx512vl(auVar110);
  auVar109 = vcvtdq2ps_avx(auVar106);
  auVar110 = vcvtdq2ps_avx(auVar103);
  auVar106 = vcvtdq2ps_avx(auVar104);
  auVar97 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar213 = ZEXT3264(auVar97);
  auVar103 = ZEXT1632(CONCAT412(fVar163 * (ray->super_RayK<1>).dir.field_0.m128[3],
                                CONCAT48(fVar163 * (ray->super_RayK<1>).dir.field_0.m128[2],
                                         CONCAT44(fVar163 * (ray->super_RayK<1>).dir.field_0.m128[1]
                                                  ,fVar208))));
  auVar98 = vpermps_avx512vl(auVar97,auVar103);
  auVar99 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar214 = ZEXT3264(auVar99);
  auVar100 = vpermps_avx512vl(auVar99,auVar103);
  auVar101 = vmulps_avx512vl(auVar100,auVar95);
  auVar103._4_4_ = auVar109._4_4_ * auVar100._4_4_;
  auVar103._0_4_ = auVar109._0_4_ * auVar100._0_4_;
  auVar103._8_4_ = auVar109._8_4_ * auVar100._8_4_;
  auVar103._12_4_ = auVar109._12_4_ * auVar100._12_4_;
  auVar103._16_4_ = auVar109._16_4_ * auVar100._16_4_;
  auVar103._20_4_ = auVar109._20_4_ * auVar100._20_4_;
  auVar103._24_4_ = auVar109._24_4_ * auVar100._24_4_;
  auVar103._28_4_ = auVar102._28_4_;
  auVar104._4_4_ = auVar106._4_4_ * auVar100._4_4_;
  auVar104._0_4_ = auVar106._0_4_ * auVar100._0_4_;
  auVar104._8_4_ = auVar106._8_4_ * auVar100._8_4_;
  auVar104._12_4_ = auVar106._12_4_ * auVar100._12_4_;
  auVar104._16_4_ = auVar106._16_4_ * auVar100._16_4_;
  auVar104._20_4_ = auVar106._20_4_ * auVar100._20_4_;
  auVar104._24_4_ = auVar106._24_4_ * auVar100._24_4_;
  auVar104._28_4_ = auVar100._28_4_;
  auVar102 = vfmadd231ps_avx512vl(auVar101,auVar98,auVar94);
  auVar103 = vfmadd231ps_avx512vl(auVar103,auVar98,auVar96);
  auVar104 = vfmadd231ps_avx512vl(auVar104,auVar110,auVar98);
  auVar98 = vpmovsxwd_avx512vl(*(undefined1 (*) [16])(prim + uVar84 * 0xd + 6));
  auVar105 = vcvtdq2ps_avx512vl(auVar105);
  auVar100 = vcvtdq2ps_avx512vl(auVar107);
  auVar101 = vcvtdq2ps_avx512vl(auVar108);
  auVar150._4_4_ = fVar208;
  auVar150._0_4_ = fVar208;
  auVar150._8_4_ = fVar208;
  auVar150._12_4_ = fVar208;
  auVar150._16_4_ = fVar208;
  auVar150._20_4_ = fVar208;
  auVar150._24_4_ = fVar208;
  auVar150._28_4_ = fVar208;
  auVar102 = vfmadd231ps_avx512vl(auVar102,auVar150,auVar105);
  auVar103 = vfmadd231ps_avx512vl(auVar103,auVar150,auVar100);
  auVar104 = vfmadd231ps_avx512vl(auVar104,auVar101,auVar150);
  auVar150 = ZEXT1632(CONCAT412(fVar163 * auVar88._12_4_,
                                CONCAT48(fVar163 * auVar88._8_4_,
                                         CONCAT44(fVar163 * auVar88._4_4_,fVar209))));
  auVar99 = vpermps_avx512vl(auVar99,auVar150);
  auVar95 = vmulps_avx512vl(auVar99,auVar95);
  auVar108._4_4_ = auVar109._4_4_ * auVar99._4_4_;
  auVar108._0_4_ = auVar109._0_4_ * auVar99._0_4_;
  auVar108._8_4_ = auVar109._8_4_ * auVar99._8_4_;
  auVar108._12_4_ = auVar109._12_4_ * auVar99._12_4_;
  auVar108._16_4_ = auVar109._16_4_ * auVar99._16_4_;
  auVar108._20_4_ = auVar109._20_4_ * auVar99._20_4_;
  auVar108._24_4_ = auVar109._24_4_ * auVar99._24_4_;
  auVar108._28_4_ = auVar107._28_4_;
  auVar109._4_4_ = auVar106._4_4_ * auVar99._4_4_;
  auVar109._0_4_ = auVar106._0_4_ * auVar99._0_4_;
  auVar109._8_4_ = auVar106._8_4_ * auVar99._8_4_;
  auVar109._12_4_ = auVar106._12_4_ * auVar99._12_4_;
  auVar109._16_4_ = auVar106._16_4_ * auVar99._16_4_;
  auVar109._20_4_ = auVar106._20_4_ * auVar99._20_4_;
  auVar109._24_4_ = auVar106._24_4_ * auVar99._24_4_;
  auVar109._28_4_ = auVar99._28_4_;
  auVar202._4_4_ = fVar209;
  auVar202._0_4_ = fVar209;
  auVar202._8_4_ = fVar209;
  auVar202._12_4_ = fVar209;
  auVar202._16_4_ = fVar209;
  auVar202._20_4_ = fVar209;
  auVar202._24_4_ = fVar209;
  auVar202._28_4_ = fVar209;
  auVar106 = vpermps_avx512vl(auVar97,auVar150);
  auVar107 = vfmadd231ps_avx512vl(auVar95,auVar106,auVar94);
  auVar108 = vfmadd231ps_avx512vl(auVar108,auVar106,auVar96);
  auVar88 = vfmadd231ps_fma(auVar109,auVar106,auVar110);
  auVar105 = vfmadd231ps_avx512vl(auVar107,auVar202,auVar105);
  auVar108 = vfmadd231ps_avx512vl(auVar108,auVar202,auVar100);
  auVar95 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),auVar202,auVar101);
  auVar207._8_4_ = 0x7fffffff;
  auVar207._0_8_ = 0x7fffffff7fffffff;
  auVar207._12_4_ = 0x7fffffff;
  auVar207._16_4_ = 0x7fffffff;
  auVar207._20_4_ = 0x7fffffff;
  auVar207._24_4_ = 0x7fffffff;
  auVar207._28_4_ = 0x7fffffff;
  auVar109 = vandps_avx(auVar102,auVar207);
  auVar101._8_4_ = 0x219392ef;
  auVar101._0_8_ = 0x219392ef219392ef;
  auVar101._12_4_ = 0x219392ef;
  auVar101._16_4_ = 0x219392ef;
  auVar101._20_4_ = 0x219392ef;
  auVar101._24_4_ = 0x219392ef;
  auVar101._28_4_ = 0x219392ef;
  uVar80 = vcmpps_avx512vl(auVar109,auVar101,1);
  bVar16 = (bool)((byte)uVar80 & 1);
  auVar96._0_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar102._0_4_;
  bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
  auVar96._4_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar102._4_4_;
  bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
  auVar96._8_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar102._8_4_;
  bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
  auVar96._12_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar102._12_4_;
  bVar16 = (bool)((byte)(uVar80 >> 4) & 1);
  auVar96._16_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar102._16_4_;
  bVar16 = (bool)((byte)(uVar80 >> 5) & 1);
  auVar96._20_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar102._20_4_;
  bVar16 = (bool)((byte)(uVar80 >> 6) & 1);
  auVar96._24_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar102._24_4_;
  bVar16 = SUB81(uVar80 >> 7,0);
  auVar96._28_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar102._28_4_;
  auVar109 = vandps_avx(auVar207,auVar103);
  uVar80 = vcmpps_avx512vl(auVar109,auVar101,1);
  bVar16 = (bool)((byte)uVar80 & 1);
  auVar97._0_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar103._0_4_;
  bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
  auVar97._4_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar103._4_4_;
  bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
  auVar97._8_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar103._8_4_;
  bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
  auVar97._12_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar103._12_4_;
  bVar16 = (bool)((byte)(uVar80 >> 4) & 1);
  auVar97._16_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar103._16_4_;
  bVar16 = (bool)((byte)(uVar80 >> 5) & 1);
  auVar97._20_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar103._20_4_;
  bVar16 = (bool)((byte)(uVar80 >> 6) & 1);
  auVar97._24_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar103._24_4_;
  bVar16 = SUB81(uVar80 >> 7,0);
  auVar97._28_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar103._28_4_;
  auVar109 = vandps_avx(auVar207,auVar104);
  uVar80 = vcmpps_avx512vl(auVar109,auVar101,1);
  bVar16 = (bool)((byte)uVar80 & 1);
  auVar99._0_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar104._0_4_;
  bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
  auVar99._4_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar104._4_4_;
  bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
  auVar99._8_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar104._8_4_;
  bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
  auVar99._12_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar104._12_4_;
  bVar16 = (bool)((byte)(uVar80 >> 4) & 1);
  auVar99._16_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar104._16_4_;
  bVar16 = (bool)((byte)(uVar80 >> 5) & 1);
  auVar99._20_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar104._20_4_;
  bVar16 = (bool)((byte)(uVar80 >> 6) & 1);
  auVar99._24_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar104._24_4_;
  bVar16 = SUB81(uVar80 >> 7,0);
  auVar99._28_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar104._28_4_;
  auVar109 = vrcp14ps_avx512vl(auVar96);
  auVar205._8_4_ = 0x3f800000;
  auVar205._0_8_ = 0x3f8000003f800000;
  auVar205._12_4_ = 0x3f800000;
  auVar205._16_4_ = 0x3f800000;
  auVar205._20_4_ = 0x3f800000;
  auVar205._24_4_ = 0x3f800000;
  auVar205._28_4_ = 0x3f800000;
  auVar88 = vfnmadd213ps_fma(auVar96,auVar109,auVar205);
  auVar88 = vfmadd132ps_fma(ZEXT1632(auVar88),auVar109,auVar109);
  auVar109 = vrcp14ps_avx512vl(auVar97);
  auVar87 = vfnmadd213ps_fma(auVar97,auVar109,auVar205);
  auVar87 = vfmadd132ps_fma(ZEXT1632(auVar87),auVar109,auVar109);
  auVar109 = vrcp14ps_avx512vl(auVar99);
  auVar92 = vfnmadd213ps_fma(auVar99,auVar109,auVar205);
  auVar92 = vfmadd132ps_fma(ZEXT1632(auVar92),auVar109,auVar109);
  auVar100._4_4_ = fVar195;
  auVar100._0_4_ = fVar195;
  auVar100._8_4_ = fVar195;
  auVar100._12_4_ = fVar195;
  auVar100._16_4_ = fVar195;
  auVar100._20_4_ = fVar195;
  auVar100._24_4_ = fVar195;
  auVar100._28_4_ = fVar195;
  auVar109 = vcvtdq2ps_avx(auVar111);
  auVar110 = vcvtdq2ps_avx(auVar112);
  auVar110 = vsubps_avx(auVar110,auVar109);
  auVar7 = vfmadd213ps_fma(auVar110,auVar100,auVar109);
  auVar109 = vcvtdq2ps_avx(auVar113);
  auVar110 = vcvtdq2ps_avx512vl(auVar98);
  auVar110 = vsubps_avx(auVar110,auVar109);
  auVar8 = vfmadd213ps_fma(auVar110,auVar100,auVar109);
  auVar109 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar84 * 0x12 + 6));
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar110 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar84 * 0x16 + 6));
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar110 = vsubps_avx(auVar110,auVar109);
  auVar106 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar84 * 0x14 + 6));
  auVar9 = vfmadd213ps_fma(auVar110,auVar100,auVar109);
  auVar109 = vcvtdq2ps_avx(auVar106);
  auVar110 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar84 * 0x18 + 6));
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar110 = vsubps_avx(auVar110,auVar109);
  auVar10 = vfmadd213ps_fma(auVar110,auVar100,auVar109);
  auVar109 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar84 * 0x1d + 6));
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar110 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar84 * 0x21 + 6));
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar110 = vsubps_avx(auVar110,auVar109);
  auVar11 = vfmadd213ps_fma(auVar110,auVar100,auVar109);
  auVar109 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar84 * 0x1f + 6));
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar110 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar84 * 0x23 + 6));
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar110 = vsubps_avx(auVar110,auVar109);
  auVar12 = vfmadd213ps_fma(auVar110,auVar100,auVar109);
  auVar109 = vsubps_avx(ZEXT1632(auVar7),auVar105);
  auVar107._4_4_ = auVar88._4_4_ * auVar109._4_4_;
  auVar107._0_4_ = auVar88._0_4_ * auVar109._0_4_;
  auVar107._8_4_ = auVar88._8_4_ * auVar109._8_4_;
  auVar107._12_4_ = auVar88._12_4_ * auVar109._12_4_;
  auVar107._16_4_ = auVar109._16_4_ * 0.0;
  auVar107._20_4_ = auVar109._20_4_ * 0.0;
  auVar107._24_4_ = auVar109._24_4_ * 0.0;
  auVar107._28_4_ = auVar109._28_4_;
  auVar109 = vsubps_avx(ZEXT1632(auVar8),auVar105);
  auVar111._4_4_ = auVar88._4_4_ * auVar109._4_4_;
  auVar111._0_4_ = auVar88._0_4_ * auVar109._0_4_;
  auVar111._8_4_ = auVar88._8_4_ * auVar109._8_4_;
  auVar111._12_4_ = auVar88._12_4_ * auVar109._12_4_;
  auVar111._16_4_ = auVar109._16_4_ * 0.0;
  auVar111._20_4_ = auVar109._20_4_ * 0.0;
  auVar111._24_4_ = auVar109._24_4_ * 0.0;
  auVar111._28_4_ = auVar109._28_4_;
  auVar109 = vsubps_avx(ZEXT1632(auVar9),auVar108);
  auVar112._4_4_ = auVar87._4_4_ * auVar109._4_4_;
  auVar112._0_4_ = auVar87._0_4_ * auVar109._0_4_;
  auVar112._8_4_ = auVar87._8_4_ * auVar109._8_4_;
  auVar112._12_4_ = auVar87._12_4_ * auVar109._12_4_;
  auVar112._16_4_ = auVar109._16_4_ * 0.0;
  auVar112._20_4_ = auVar109._20_4_ * 0.0;
  auVar112._24_4_ = auVar109._24_4_ * 0.0;
  auVar112._28_4_ = auVar109._28_4_;
  auVar109 = vsubps_avx(ZEXT1632(auVar10),auVar108);
  auVar113._4_4_ = auVar87._4_4_ * auVar109._4_4_;
  auVar113._0_4_ = auVar87._0_4_ * auVar109._0_4_;
  auVar113._8_4_ = auVar87._8_4_ * auVar109._8_4_;
  auVar113._12_4_ = auVar87._12_4_ * auVar109._12_4_;
  auVar113._16_4_ = auVar109._16_4_ * 0.0;
  auVar113._20_4_ = auVar109._20_4_ * 0.0;
  auVar113._24_4_ = auVar109._24_4_ * 0.0;
  auVar113._28_4_ = auVar109._28_4_;
  auVar109 = vsubps_avx(ZEXT1632(auVar11),auVar95);
  auVar94._4_4_ = auVar92._4_4_ * auVar109._4_4_;
  auVar94._0_4_ = auVar92._0_4_ * auVar109._0_4_;
  auVar94._8_4_ = auVar92._8_4_ * auVar109._8_4_;
  auVar94._12_4_ = auVar92._12_4_ * auVar109._12_4_;
  auVar94._16_4_ = auVar109._16_4_ * 0.0;
  auVar94._20_4_ = auVar109._20_4_ * 0.0;
  auVar94._24_4_ = auVar109._24_4_ * 0.0;
  auVar94._28_4_ = auVar109._28_4_;
  auVar109 = vsubps_avx(ZEXT1632(auVar12),auVar95);
  auVar95._4_4_ = auVar92._4_4_ * auVar109._4_4_;
  auVar95._0_4_ = auVar92._0_4_ * auVar109._0_4_;
  auVar95._8_4_ = auVar92._8_4_ * auVar109._8_4_;
  auVar95._12_4_ = auVar92._12_4_ * auVar109._12_4_;
  auVar95._16_4_ = auVar109._16_4_ * 0.0;
  auVar95._20_4_ = auVar109._20_4_ * 0.0;
  auVar95._24_4_ = auVar109._24_4_ * 0.0;
  auVar95._28_4_ = auVar109._28_4_;
  auVar109 = vpminsd_avx2(auVar107,auVar111);
  auVar110 = vpminsd_avx2(auVar112,auVar113);
  auVar109 = vmaxps_avx(auVar109,auVar110);
  auVar110 = vpminsd_avx2(auVar94,auVar95);
  uVar148 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar106._4_4_ = uVar148;
  auVar106._0_4_ = uVar148;
  auVar106._8_4_ = uVar148;
  auVar106._12_4_ = uVar148;
  auVar106._16_4_ = uVar148;
  auVar106._20_4_ = uVar148;
  auVar106._24_4_ = uVar148;
  auVar106._28_4_ = uVar148;
  auVar110 = vmaxps_avx512vl(auVar110,auVar106);
  auVar109 = vmaxps_avx(auVar109,auVar110);
  auVar110._8_4_ = 0x3f7ffffa;
  auVar110._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar110._12_4_ = 0x3f7ffffa;
  auVar110._16_4_ = 0x3f7ffffa;
  auVar110._20_4_ = 0x3f7ffffa;
  auVar110._24_4_ = 0x3f7ffffa;
  auVar110._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar109,auVar110);
  auVar109 = vpmaxsd_avx2(auVar107,auVar111);
  auVar110 = vpmaxsd_avx2(auVar112,auVar113);
  auVar109 = vminps_avx(auVar109,auVar110);
  auVar110 = vpmaxsd_avx2(auVar94,auVar95);
  fVar163 = (ray->super_RayK<1>).tfar;
  auVar105._4_4_ = fVar163;
  auVar105._0_4_ = fVar163;
  auVar105._8_4_ = fVar163;
  auVar105._12_4_ = fVar163;
  auVar105._16_4_ = fVar163;
  auVar105._20_4_ = fVar163;
  auVar105._24_4_ = fVar163;
  auVar105._28_4_ = fVar163;
  auVar110 = vminps_avx512vl(auVar110,auVar105);
  auVar109 = vminps_avx(auVar109,auVar110);
  auVar102._8_4_ = 0x3f800003;
  auVar102._0_8_ = 0x3f8000033f800003;
  auVar102._12_4_ = 0x3f800003;
  auVar102._16_4_ = 0x3f800003;
  auVar102._20_4_ = 0x3f800003;
  auVar102._24_4_ = 0x3f800003;
  auVar102._28_4_ = 0x3f800003;
  auVar109 = vmulps_avx512vl(auVar109,auVar102);
  uVar158 = vcmpps_avx512vl(local_80,auVar109,2);
  uVar23 = vpcmpgtd_avx512vl(auVar93,_DAT_01fb4ba0);
  local_530 = (ulong)(byte)((byte)uVar158 & (byte)uVar23);
  auVar215 = ZEXT464(0xbf800000);
  local_520 = prim;
  local_540 = ray;
  do {
    if (local_530 == 0) {
      return;
    }
    lVar81 = 0;
    for (uVar80 = local_530; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x8000000000000000) {
      lVar81 = lVar81 + 1;
    }
    uVar83 = *(uint *)(prim + 2);
    uVar75 = *(uint *)(prim + lVar81 * 4 + 6);
    local_538 = (ulong)uVar83;
    pGVar79 = (context->scene->geometries).items[uVar83].ptr;
    local_528 = (ulong)uVar75;
    uVar80 = (ulong)*(uint *)(*(long *)&pGVar79->field_0x58 +
                             (ulong)uVar75 *
                             pGVar79[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i);
    fVar163 = (pGVar79->time_range).lower;
    fVar163 = pGVar79->fnumTimeSegments *
              (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar163) /
              ((pGVar79->time_range).upper - fVar163));
    auVar88 = vroundss_avx(ZEXT416((uint)fVar163),ZEXT416((uint)fVar163),9);
    auVar87 = vaddss_avx512f(ZEXT416((uint)pGVar79->fnumTimeSegments),auVar215._0_16_);
    auVar88 = vminss_avx(auVar88,auVar87);
    auVar88 = vmaxss_avx(ZEXT816(0) << 0x20,auVar88);
    fVar163 = fVar163 - auVar88._0_4_;
    _Var14 = pGVar79[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar77 = (long)(int)auVar88._0_4_ * 0x38;
    lVar81 = *(long *)(_Var14 + 0x10 + lVar77);
    lVar76 = *(long *)(_Var14 + 0x38 + lVar77);
    lVar78 = *(long *)(_Var14 + 0x48 + lVar77);
    auVar159._4_4_ = fVar163;
    auVar159._0_4_ = fVar163;
    auVar159._8_4_ = fVar163;
    auVar159._12_4_ = fVar163;
    pfVar3 = (float *)(lVar76 + uVar80 * lVar78);
    auVar204._0_4_ = fVar163 * *pfVar3;
    auVar204._4_4_ = fVar163 * pfVar3[1];
    auVar204._8_4_ = fVar163 * pfVar3[2];
    auVar204._12_4_ = fVar163 * pfVar3[3];
    pfVar3 = (float *)(lVar76 + (uVar80 + 1) * lVar78);
    auVar206._0_4_ = fVar163 * *pfVar3;
    auVar206._4_4_ = fVar163 * pfVar3[1];
    auVar206._8_4_ = fVar163 * pfVar3[2];
    auVar206._12_4_ = fVar163 * pfVar3[3];
    auVar88 = vmulps_avx512vl(auVar159,*(undefined1 (*) [16])(lVar76 + (uVar80 + 2) * lVar78));
    auVar87 = vmulps_avx512vl(auVar159,*(undefined1 (*) [16])(lVar76 + lVar78 * (uVar80 + 3)));
    lVar76 = *(long *)(_Var14 + lVar77);
    fVar163 = 1.0 - fVar163;
    auVar149._4_4_ = fVar163;
    auVar149._0_4_ = fVar163;
    auVar149._8_4_ = fVar163;
    auVar149._12_4_ = fVar163;
    local_4b0 = vfmadd231ps_fma(auVar204,auVar149,*(undefined1 (*) [16])(lVar76 + lVar81 * uVar80));
    local_4c0 = vfmadd231ps_fma(auVar206,auVar149,
                                *(undefined1 (*) [16])(lVar76 + lVar81 * (uVar80 + 1)));
    local_4d0 = vfmadd231ps_avx512vl
                          (auVar88,auVar149,*(undefined1 (*) [16])(lVar76 + lVar81 * (uVar80 + 2)));
    _local_4e0 = vfmadd231ps_avx512vl
                           (auVar87,auVar149,*(undefined1 (*) [16])(lVar76 + lVar81 * (uVar80 + 3)))
    ;
    iVar13 = (int)pGVar79[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    aVar4 = (local_540->super_RayK<1>).org.field_0;
    auVar87 = vsubps_avx(local_4b0,(undefined1  [16])aVar4);
    uVar148 = auVar87._0_4_;
    auVar160._4_4_ = uVar148;
    auVar160._0_4_ = uVar148;
    auVar160._8_4_ = uVar148;
    auVar160._12_4_ = uVar148;
    auVar88 = vshufps_avx(auVar87,auVar87,0x55);
    aVar5 = (local_518->ray_space).vx.field_0;
    aVar6 = (local_518->ray_space).vy.field_0;
    fVar163 = (local_518->ray_space).vz.field_0.m128[0];
    fVar195 = (local_518->ray_space).vz.field_0.m128[1];
    fVar208 = (local_518->ray_space).vz.field_0.m128[2];
    fVar209 = (local_518->ray_space).vz.field_0.m128[3];
    auVar87 = vshufps_avx(auVar87,auVar87,0xaa);
    auVar91._0_4_ = auVar87._0_4_ * fVar163;
    auVar91._4_4_ = auVar87._4_4_ * fVar195;
    auVar91._8_4_ = auVar87._8_4_ * fVar208;
    auVar91._12_4_ = auVar87._12_4_ * fVar209;
    auVar88 = vfmadd231ps_fma(auVar91,(undefined1  [16])aVar6,auVar88);
    auVar92 = vfmadd231ps_fma(auVar88,(undefined1  [16])aVar5,auVar160);
    auVar87 = vsubps_avx(local_4c0,(undefined1  [16])aVar4);
    uVar148 = auVar87._0_4_;
    auVar161._4_4_ = uVar148;
    auVar161._0_4_ = uVar148;
    auVar161._8_4_ = uVar148;
    auVar161._12_4_ = uVar148;
    auVar88 = vshufps_avx(auVar87,auVar87,0x55);
    auVar87 = vshufps_avx(auVar87,auVar87,0xaa);
    auVar197._0_4_ = auVar87._0_4_ * fVar163;
    auVar197._4_4_ = auVar87._4_4_ * fVar195;
    auVar197._8_4_ = auVar87._8_4_ * fVar208;
    auVar197._12_4_ = auVar87._12_4_ * fVar209;
    auVar88 = vfmadd231ps_fma(auVar197,(undefined1  [16])aVar6,auVar88);
    auVar7 = vfmadd231ps_fma(auVar88,(undefined1  [16])aVar5,auVar161);
    auVar87 = vsubps_avx512vl(local_4d0,(undefined1  [16])aVar4);
    uVar148 = auVar87._0_4_;
    auVar89._4_4_ = uVar148;
    auVar89._0_4_ = uVar148;
    auVar89._8_4_ = uVar148;
    auVar89._12_4_ = uVar148;
    auVar88 = vshufps_avx(auVar87,auVar87,0x55);
    auVar87 = vshufps_avx(auVar87,auVar87,0xaa);
    auVar200._0_4_ = auVar87._0_4_ * fVar163;
    auVar200._4_4_ = auVar87._4_4_ * fVar195;
    auVar200._8_4_ = auVar87._8_4_ * fVar208;
    auVar200._12_4_ = auVar87._12_4_ * fVar209;
    auVar88 = vfmadd231ps_fma(auVar200,(undefined1  [16])aVar6,auVar88);
    auVar8 = vfmadd231ps_fma(auVar88,(undefined1  [16])aVar5,auVar89);
    local_3c0 = ZEXT1632((undefined1  [16])aVar4);
    auVar87 = vsubps_avx512vl(_local_4e0,(undefined1  [16])aVar4);
    uVar148 = auVar87._0_4_;
    auVar90._4_4_ = uVar148;
    auVar90._0_4_ = uVar148;
    auVar90._8_4_ = uVar148;
    auVar90._12_4_ = uVar148;
    auVar88 = vshufps_avx(auVar87,auVar87,0x55);
    auVar87 = vshufps_avx(auVar87,auVar87,0xaa);
    auVar201._0_4_ = auVar87._0_4_ * fVar163;
    auVar201._4_4_ = auVar87._4_4_ * fVar195;
    auVar201._8_4_ = auVar87._8_4_ * fVar208;
    auVar201._12_4_ = auVar87._12_4_ * fVar209;
    auVar88 = vfmadd231ps_fma(auVar201,(undefined1  [16])aVar6,auVar88);
    auVar9 = vfmadd231ps_fma(auVar88,(undefined1  [16])aVar5,auVar90);
    local_548 = (long)iVar13;
    lVar81 = local_548 * 0x44;
    auVar109 = *(undefined1 (*) [32])(bspline_basis0 + lVar81);
    uVar148 = auVar92._0_4_;
    local_2c0._4_4_ = uVar148;
    local_2c0._0_4_ = uVar148;
    local_2c0._8_4_ = uVar148;
    local_2c0._12_4_ = uVar148;
    local_2c0._16_4_ = uVar148;
    local_2c0._20_4_ = uVar148;
    local_2c0._24_4_ = uVar148;
    local_2c0._28_4_ = uVar148;
    auVar97 = auVar213._0_32_;
    local_2e0 = vpermps_avx512vl(auVar97,ZEXT1632(auVar92));
    auVar110 = *(undefined1 (*) [32])(bspline_basis0 + lVar81 + 0x484);
    uVar148 = auVar7._0_4_;
    auVar175._4_4_ = uVar148;
    auVar175._0_4_ = uVar148;
    auVar175._8_4_ = uVar148;
    auVar175._12_4_ = uVar148;
    local_300._16_4_ = uVar148;
    local_300._0_16_ = auVar175;
    local_300._20_4_ = uVar148;
    local_300._24_4_ = uVar148;
    local_300._28_4_ = uVar148;
    auVar106 = *(undefined1 (*) [32])(bspline_basis0 + lVar81 + 0x908);
    local_320 = vpermps_avx512vl(auVar97,ZEXT1632(auVar7));
    local_340 = vbroadcastss_avx512vl(auVar8);
    local_360 = vpermps_avx512vl(auVar97,ZEXT1632(auVar8));
    auVar105 = *(undefined1 (*) [32])(bspline_basis0 + lVar81 + 0xd8c);
    fVar195 = auVar9._0_4_;
    local_380._4_4_ = fVar195;
    local_380._0_4_ = fVar195;
    fStack_378 = fVar195;
    fStack_374 = fVar195;
    fStack_370 = fVar195;
    fStack_36c = fVar195;
    fStack_368 = fVar195;
    register0x0000139c = fVar195;
    _local_3a0 = vpermps_avx512vl(auVar97,ZEXT1632(auVar9));
    auVar102 = vmulps_avx512vl(_local_380,auVar105);
    auVar107 = vmulps_avx512vl(_local_3a0,auVar105);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar106,local_340);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar106,local_360);
    auVar88 = vfmadd231ps_fma(auVar102,auVar110,local_300);
    auVar108 = vfmadd231ps_avx512vl(auVar107,auVar110,local_320);
    auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),auVar109,local_2c0);
    auVar192 = ZEXT3264(auVar104);
    auVar102 = *(undefined1 (*) [32])(bspline_basis1 + lVar81);
    auVar107 = *(undefined1 (*) [32])(bspline_basis1 + lVar81 + 0x484);
    auVar111 = vfmadd231ps_avx512vl(auVar108,auVar109,local_2e0);
    auVar191 = ZEXT3264(auVar111);
    auVar108 = *(undefined1 (*) [32])(bspline_basis1 + lVar81 + 0x908);
    auVar103 = *(undefined1 (*) [32])(bspline_basis1 + lVar81 + 0xd8c);
    auVar112 = vmulps_avx512vl(_local_380,auVar103);
    auVar113 = vmulps_avx512vl(_local_3a0,auVar103);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar108,local_340);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar108,local_360);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar107,local_300);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar107,local_320);
    auVar10 = vfmadd231ps_fma(auVar112,auVar102,local_2c0);
    auVar193 = ZEXT1664(auVar10);
    auVar11 = vfmadd231ps_fma(auVar113,auVar102,local_2e0);
    auVar112 = vsubps_avx512vl(ZEXT1632(auVar10),auVar104);
    auVar113 = vsubps_avx512vl(ZEXT1632(auVar11),auVar111);
    auVar94 = vmulps_avx512vl(auVar111,auVar112);
    auVar95 = vmulps_avx512vl(auVar104,auVar113);
    auVar94 = vsubps_avx512vl(auVar94,auVar95);
    auVar88 = vshufps_avx(local_4b0,local_4b0,0xff);
    uVar158 = auVar88._0_8_;
    local_a0._8_8_ = uVar158;
    local_a0._0_8_ = uVar158;
    local_a0._16_8_ = uVar158;
    local_a0._24_8_ = uVar158;
    auVar88 = vshufps_avx(local_4c0,local_4c0,0xff);
    local_c0 = vbroadcastsd_avx512vl(auVar88);
    auVar88 = vshufps_avx512vl(local_4d0,local_4d0,0xff);
    local_e0 = vbroadcastsd_avx512vl(auVar88);
    auVar88 = vshufps_avx512vl(_local_4e0,_local_4e0,0xff);
    uVar158 = auVar88._0_8_;
    local_100._8_8_ = uVar158;
    local_100._0_8_ = uVar158;
    local_100._16_8_ = uVar158;
    local_100._24_8_ = uVar158;
    auVar95 = vmulps_avx512vl(local_100,auVar105);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar106,local_e0);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar110,local_c0);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar109,local_a0);
    auVar93 = vmulps_avx512vl(local_100,auVar103);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar108,local_e0);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar107,local_c0);
    auVar12 = vfmadd231ps_fma(auVar93,auVar102,local_a0);
    auVar93 = vmulps_avx512vl(auVar113,auVar113);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar112,auVar112);
    auVar96 = vmaxps_avx512vl(auVar95,ZEXT1632(auVar12));
    auVar96 = vmulps_avx512vl(auVar96,auVar96);
    auVar93 = vmulps_avx512vl(auVar96,auVar93);
    auVar94 = vmulps_avx512vl(auVar94,auVar94);
    uVar158 = vcmpps_avx512vl(auVar94,auVar93,2);
    auVar161 = local_4b0;
    auVar88 = vblendps_avx(auVar92,local_4b0,8);
    auVar89 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar87 = vandps_avx512vl(auVar88,auVar89);
    auVar160 = local_4c0;
    auVar88 = vblendps_avx(auVar7,local_4c0,8);
    auVar88 = vandps_avx512vl(auVar88,auVar89);
    auVar87 = vmaxps_avx(auVar87,auVar88);
    auVar159 = local_4d0;
    auVar88 = vblendps_avx(auVar8,local_4d0,8);
    auVar90 = vandps_avx512vl(auVar88,auVar89);
    auVar149 = _local_4e0;
    auVar88 = vblendps_avx(auVar9,_local_4e0,8);
    auVar88 = vandps_avx512vl(auVar88,auVar89);
    auVar88 = vmaxps_avx(auVar90,auVar88);
    auVar88 = vmaxps_avx(auVar87,auVar88);
    auVar87 = vmovshdup_avx(auVar88);
    auVar87 = vmaxss_avx(auVar87,auVar88);
    auVar88 = vshufpd_avx(auVar88,auVar88,1);
    auVar88 = vmaxss_avx(auVar88,auVar87);
    auVar87 = vcvtsi2ss_avx512f(auVar213._0_16_,iVar13);
    local_440._0_16_ = auVar87;
    auVar93._0_4_ = auVar87._0_4_;
    auVar93._4_4_ = auVar93._0_4_;
    auVar93._8_4_ = auVar93._0_4_;
    auVar93._12_4_ = auVar93._0_4_;
    auVar93._16_4_ = auVar93._0_4_;
    auVar93._20_4_ = auVar93._0_4_;
    auVar93._24_4_ = auVar93._0_4_;
    auVar93._28_4_ = auVar93._0_4_;
    uVar23 = vcmpps_avx512vl(auVar93,_DAT_01f7b060,0xe);
    bVar82 = (byte)uVar158 & (byte)uVar23;
    fVar163 = auVar88._0_4_ * 4.7683716e-07;
    local_420._0_16_ = ZEXT416((uint)fVar163);
    auVar96 = auVar214._0_32_;
    auVar94 = vpermps_avx512vl(auVar96,ZEXT1632(auVar92));
    local_140 = vpermps_avx512vl(auVar96,ZEXT1632(auVar7));
    local_160 = vpermps_avx512vl(auVar96,ZEXT1632(auVar8));
    local_180 = vpermps_avx512vl(auVar96,ZEXT1632(auVar9));
    ray = local_540;
    _local_4e0 = auVar149;
    local_4d0 = auVar159;
    local_4c0 = auVar160;
    local_4b0 = auVar161;
    if (bVar82 != 0) {
      auVar103 = vmulps_avx512vl(local_180,auVar103);
      auVar108 = vfmadd213ps_avx512vl(auVar108,local_160,auVar103);
      auVar107 = vfmadd213ps_avx512vl(auVar107,local_140,auVar108);
      auVar107 = vfmadd213ps_avx512vl(auVar102,auVar94,auVar107);
      auVar105 = vmulps_avx512vl(local_180,auVar105);
      auVar106 = vfmadd213ps_avx512vl(auVar106,local_160,auVar105);
      auVar108 = vfmadd213ps_avx512vl(auVar110,local_140,auVar106);
      auVar110 = *(undefined1 (*) [32])(bspline_basis0 + lVar81 + 0x1210);
      auVar106 = *(undefined1 (*) [32])(bspline_basis0 + lVar81 + 0x1694);
      auVar105 = *(undefined1 (*) [32])(bspline_basis0 + lVar81 + 0x1b18);
      auVar102 = *(undefined1 (*) [32])(bspline_basis0 + lVar81 + 0x1f9c);
      auVar108 = vfmadd213ps_avx512vl(auVar109,auVar94,auVar108);
      auVar198._0_4_ = fVar195 * auVar102._0_4_;
      auVar198._4_4_ = fVar195 * auVar102._4_4_;
      auVar198._8_4_ = fVar195 * auVar102._8_4_;
      auVar198._12_4_ = fVar195 * auVar102._12_4_;
      auVar198._16_4_ = fVar195 * auVar102._16_4_;
      auVar198._20_4_ = fVar195 * auVar102._20_4_;
      auVar198._24_4_ = fVar195 * auVar102._24_4_;
      auVar198._28_4_ = 0;
      auVar109 = vmulps_avx512vl(_local_3a0,auVar102);
      auVar102 = vmulps_avx512vl(local_180,auVar102);
      auVar103 = vfmadd231ps_avx512vl(auVar198,auVar105,local_340);
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar105,local_360);
      auVar105 = vfmadd231ps_avx512vl(auVar102,local_160,auVar105);
      auVar102 = vfmadd231ps_avx512vl(auVar103,auVar106,local_300);
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar106,local_320);
      auVar103 = vfmadd231ps_avx512vl(auVar105,local_140,auVar106);
      auVar88 = vfmadd231ps_fma(auVar102,auVar110,local_2c0);
      auVar102 = vfmadd231ps_avx512vl(auVar109,auVar110,local_2e0);
      auVar109 = *(undefined1 (*) [32])(bspline_basis1 + lVar81 + 0x1210);
      auVar106 = *(undefined1 (*) [32])(bspline_basis1 + lVar81 + 0x1b18);
      auVar105 = *(undefined1 (*) [32])(bspline_basis1 + lVar81 + 0x1f9c);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar94,auVar110);
      auVar98._4_4_ = fVar195 * auVar105._4_4_;
      auVar98._0_4_ = fVar195 * auVar105._0_4_;
      auVar98._8_4_ = fVar195 * auVar105._8_4_;
      auVar98._12_4_ = fVar195 * auVar105._12_4_;
      auVar98._16_4_ = fVar195 * auVar105._16_4_;
      auVar98._20_4_ = fVar195 * auVar105._20_4_;
      auVar98._24_4_ = fVar195 * auVar105._24_4_;
      auVar98._28_4_ = auVar110._28_4_;
      auVar110 = vmulps_avx512vl(_local_3a0,auVar105);
      auVar105 = vmulps_avx512vl(local_180,auVar105);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar106,local_340);
      auVar99 = vfmadd231ps_avx512vl(auVar110,auVar106,local_360);
      auVar212 = ZEXT3264(auVar94);
      auVar106 = vfmadd231ps_avx512vl(auVar105,local_160,auVar106);
      auVar215 = ZEXT1664(auVar215._0_16_);
      auVar213 = ZEXT3264(auVar97);
      auVar214 = ZEXT3264(auVar96);
      auVar110 = *(undefined1 (*) [32])(bspline_basis1 + lVar81 + 0x1694);
      auVar105 = vfmadd231ps_avx512vl(auVar98,auVar110,local_300);
      auVar96 = vfmadd231ps_avx512vl(auVar99,auVar110,local_320);
      auVar110 = vfmadd231ps_avx512vl(auVar106,local_140,auVar110);
      auVar87 = vfmadd231ps_fma(auVar105,auVar109,local_2c0);
      auVar106 = vfmadd231ps_avx512vl(auVar96,auVar109,local_2e0);
      auVar105 = vfmadd231ps_avx512vl(auVar110,auVar94,auVar109);
      auVar210._8_4_ = 0x7fffffff;
      auVar210._0_8_ = 0x7fffffff7fffffff;
      auVar210._12_4_ = 0x7fffffff;
      auVar210._16_4_ = 0x7fffffff;
      auVar210._20_4_ = 0x7fffffff;
      auVar210._24_4_ = 0x7fffffff;
      auVar210._28_4_ = 0x7fffffff;
      auVar109 = vandps_avx(ZEXT1632(auVar88),auVar210);
      auVar110 = vandps_avx(auVar102,auVar210);
      auVar110 = vmaxps_avx(auVar109,auVar110);
      auVar109 = vandps_avx(auVar103,auVar210);
      auVar109 = vmaxps_avx(auVar110,auVar109);
      auVar203._4_4_ = fVar163;
      auVar203._0_4_ = fVar163;
      auVar203._8_4_ = fVar163;
      auVar203._12_4_ = fVar163;
      auVar203._16_4_ = fVar163;
      auVar203._20_4_ = fVar163;
      auVar203._24_4_ = fVar163;
      auVar203._28_4_ = fVar163;
      uVar80 = vcmpps_avx512vl(auVar109,auVar203,1);
      bVar16 = (bool)((byte)uVar80 & 1);
      auVar114._0_4_ = (float)((uint)bVar16 * auVar112._0_4_ | (uint)!bVar16 * auVar88._0_4_);
      bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
      auVar114._4_4_ = (float)((uint)bVar16 * auVar112._4_4_ | (uint)!bVar16 * auVar88._4_4_);
      bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
      auVar114._8_4_ = (float)((uint)bVar16 * auVar112._8_4_ | (uint)!bVar16 * auVar88._8_4_);
      bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar114._12_4_ = (float)((uint)bVar16 * auVar112._12_4_ | (uint)!bVar16 * auVar88._12_4_);
      fVar195 = (float)((uint)((byte)(uVar80 >> 4) & 1) * auVar112._16_4_);
      auVar114._16_4_ = fVar195;
      fVar163 = (float)((uint)((byte)(uVar80 >> 5) & 1) * auVar112._20_4_);
      auVar114._20_4_ = fVar163;
      fVar208 = (float)((uint)((byte)(uVar80 >> 6) & 1) * auVar112._24_4_);
      auVar114._24_4_ = fVar208;
      uVar74 = (uint)(byte)(uVar80 >> 7) * auVar112._28_4_;
      auVar114._28_4_ = uVar74;
      bVar16 = (bool)((byte)uVar80 & 1);
      auVar115._0_4_ = (float)((uint)bVar16 * auVar113._0_4_ | (uint)!bVar16 * auVar102._0_4_);
      bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
      auVar115._4_4_ = (float)((uint)bVar16 * auVar113._4_4_ | (uint)!bVar16 * auVar102._4_4_);
      bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
      auVar115._8_4_ = (float)((uint)bVar16 * auVar113._8_4_ | (uint)!bVar16 * auVar102._8_4_);
      bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar115._12_4_ = (float)((uint)bVar16 * auVar113._12_4_ | (uint)!bVar16 * auVar102._12_4_);
      bVar16 = (bool)((byte)(uVar80 >> 4) & 1);
      auVar115._16_4_ = (float)((uint)bVar16 * auVar113._16_4_ | (uint)!bVar16 * auVar102._16_4_);
      bVar16 = (bool)((byte)(uVar80 >> 5) & 1);
      auVar115._20_4_ = (float)((uint)bVar16 * auVar113._20_4_ | (uint)!bVar16 * auVar102._20_4_);
      bVar16 = (bool)((byte)(uVar80 >> 6) & 1);
      auVar115._24_4_ = (float)((uint)bVar16 * auVar113._24_4_ | (uint)!bVar16 * auVar102._24_4_);
      bVar16 = SUB81(uVar80 >> 7,0);
      auVar115._28_4_ = (uint)bVar16 * auVar113._28_4_ | (uint)!bVar16 * auVar102._28_4_;
      auVar109 = vandps_avx(auVar210,ZEXT1632(auVar87));
      auVar110 = vandps_avx(auVar106,auVar210);
      auVar110 = vmaxps_avx(auVar109,auVar110);
      auVar109 = vandps_avx(auVar105,auVar210);
      auVar109 = vmaxps_avx(auVar110,auVar109);
      uVar80 = vcmpps_avx512vl(auVar109,auVar203,1);
      bVar16 = (bool)((byte)uVar80 & 1);
      auVar116._0_4_ = (float)((uint)bVar16 * auVar112._0_4_ | (uint)!bVar16 * auVar87._0_4_);
      bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
      auVar116._4_4_ = (float)((uint)bVar16 * auVar112._4_4_ | (uint)!bVar16 * auVar87._4_4_);
      bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
      auVar116._8_4_ = (float)((uint)bVar16 * auVar112._8_4_ | (uint)!bVar16 * auVar87._8_4_);
      bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar116._12_4_ = (float)((uint)bVar16 * auVar112._12_4_ | (uint)!bVar16 * auVar87._12_4_);
      fVar209 = (float)((uint)((byte)(uVar80 >> 4) & 1) * auVar112._16_4_);
      auVar116._16_4_ = fVar209;
      fVar196 = (float)((uint)((byte)(uVar80 >> 5) & 1) * auVar112._20_4_);
      auVar116._20_4_ = fVar196;
      fVar174 = (float)((uint)((byte)(uVar80 >> 6) & 1) * auVar112._24_4_);
      auVar116._24_4_ = fVar174;
      auVar116._28_4_ = (uint)(byte)(uVar80 >> 7) * auVar112._28_4_;
      bVar16 = (bool)((byte)uVar80 & 1);
      auVar117._0_4_ = (float)((uint)bVar16 * auVar113._0_4_ | (uint)!bVar16 * auVar106._0_4_);
      bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
      auVar117._4_4_ = (float)((uint)bVar16 * auVar113._4_4_ | (uint)!bVar16 * auVar106._4_4_);
      bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
      auVar117._8_4_ = (float)((uint)bVar16 * auVar113._8_4_ | (uint)!bVar16 * auVar106._8_4_);
      bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar117._12_4_ = (float)((uint)bVar16 * auVar113._12_4_ | (uint)!bVar16 * auVar106._12_4_);
      bVar16 = (bool)((byte)(uVar80 >> 4) & 1);
      auVar117._16_4_ = (float)((uint)bVar16 * auVar113._16_4_ | (uint)!bVar16 * auVar106._16_4_);
      bVar16 = (bool)((byte)(uVar80 >> 5) & 1);
      auVar117._20_4_ = (float)((uint)bVar16 * auVar113._20_4_ | (uint)!bVar16 * auVar106._20_4_);
      bVar16 = (bool)((byte)(uVar80 >> 6) & 1);
      auVar117._24_4_ = (float)((uint)bVar16 * auVar113._24_4_ | (uint)!bVar16 * auVar106._24_4_);
      bVar16 = SUB81(uVar80 >> 7,0);
      auVar117._28_4_ = (uint)bVar16 * auVar113._28_4_ | (uint)!bVar16 * auVar106._28_4_;
      auVar91 = vxorps_avx512vl(auVar175,auVar175);
      auVar109 = vfmadd213ps_avx512vl(auVar114,auVar114,ZEXT1632(auVar91));
      auVar88 = vfmadd231ps_fma(auVar109,auVar115,auVar115);
      auVar109 = vrsqrt14ps_avx512vl(ZEXT1632(auVar88));
      fVar85 = auVar109._0_4_;
      fVar86 = auVar109._4_4_;
      fVar139 = auVar109._8_4_;
      fVar140 = auVar109._12_4_;
      fVar141 = auVar109._16_4_;
      fVar142 = auVar109._20_4_;
      fVar144 = auVar109._24_4_;
      auVar40._4_4_ = fVar86 * fVar86 * fVar86 * auVar88._4_4_ * -0.5;
      auVar40._0_4_ = fVar85 * fVar85 * fVar85 * auVar88._0_4_ * -0.5;
      auVar40._8_4_ = fVar139 * fVar139 * fVar139 * auVar88._8_4_ * -0.5;
      auVar40._12_4_ = fVar140 * fVar140 * fVar140 * auVar88._12_4_ * -0.5;
      auVar40._16_4_ = fVar141 * fVar141 * fVar141 * -0.0;
      auVar40._20_4_ = fVar142 * fVar142 * fVar142 * -0.0;
      auVar40._24_4_ = fVar144 * fVar144 * fVar144 * -0.0;
      auVar40._28_4_ = 0;
      auVar110 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar106 = vfmadd231ps_avx512vl(auVar40,auVar110,auVar109);
      auVar41._4_4_ = auVar115._4_4_ * auVar106._4_4_;
      auVar41._0_4_ = auVar115._0_4_ * auVar106._0_4_;
      auVar41._8_4_ = auVar115._8_4_ * auVar106._8_4_;
      auVar41._12_4_ = auVar115._12_4_ * auVar106._12_4_;
      auVar41._16_4_ = auVar115._16_4_ * auVar106._16_4_;
      auVar41._20_4_ = auVar115._20_4_ * auVar106._20_4_;
      auVar41._24_4_ = auVar115._24_4_ * auVar106._24_4_;
      auVar41._28_4_ = auVar109._28_4_;
      auVar42._4_4_ = auVar106._4_4_ * -auVar114._4_4_;
      auVar42._0_4_ = auVar106._0_4_ * -auVar114._0_4_;
      auVar42._8_4_ = auVar106._8_4_ * -auVar114._8_4_;
      auVar42._12_4_ = auVar106._12_4_ * -auVar114._12_4_;
      auVar42._16_4_ = auVar106._16_4_ * -fVar195;
      auVar42._20_4_ = auVar106._20_4_ * -fVar163;
      auVar42._24_4_ = auVar106._24_4_ * -fVar208;
      auVar42._28_4_ = uVar74 ^ 0x80000000;
      auVar109 = vmulps_avx512vl(auVar106,ZEXT1632(auVar91));
      auVar112 = ZEXT1632(auVar91);
      auVar105 = vfmadd213ps_avx512vl(auVar116,auVar116,auVar112);
      auVar88 = vfmadd231ps_fma(auVar105,auVar117,auVar117);
      auVar105 = vrsqrt14ps_avx512vl(ZEXT1632(auVar88));
      fVar163 = auVar105._0_4_;
      fVar195 = auVar105._4_4_;
      fVar208 = auVar105._8_4_;
      fVar85 = auVar105._12_4_;
      fVar86 = auVar105._16_4_;
      fVar139 = auVar105._20_4_;
      fVar140 = auVar105._24_4_;
      auVar43._4_4_ = fVar195 * fVar195 * fVar195 * auVar88._4_4_ * -0.5;
      auVar43._0_4_ = fVar163 * fVar163 * fVar163 * auVar88._0_4_ * -0.5;
      auVar43._8_4_ = fVar208 * fVar208 * fVar208 * auVar88._8_4_ * -0.5;
      auVar43._12_4_ = fVar85 * fVar85 * fVar85 * auVar88._12_4_ * -0.5;
      auVar43._16_4_ = fVar86 * fVar86 * fVar86 * -0.0;
      auVar43._20_4_ = fVar139 * fVar139 * fVar139 * -0.0;
      auVar43._24_4_ = fVar140 * fVar140 * fVar140 * -0.0;
      auVar43._28_4_ = 0;
      auVar110 = vfmadd231ps_avx512vl(auVar43,auVar110,auVar105);
      auVar44._4_4_ = auVar117._4_4_ * auVar110._4_4_;
      auVar44._0_4_ = auVar117._0_4_ * auVar110._0_4_;
      auVar44._8_4_ = auVar117._8_4_ * auVar110._8_4_;
      auVar44._12_4_ = auVar117._12_4_ * auVar110._12_4_;
      auVar44._16_4_ = auVar117._16_4_ * auVar110._16_4_;
      auVar44._20_4_ = auVar117._20_4_ * auVar110._20_4_;
      auVar44._24_4_ = auVar117._24_4_ * auVar110._24_4_;
      auVar44._28_4_ = auVar105._28_4_;
      auVar45._4_4_ = -auVar116._4_4_ * auVar110._4_4_;
      auVar45._0_4_ = -auVar116._0_4_ * auVar110._0_4_;
      auVar45._8_4_ = -auVar116._8_4_ * auVar110._8_4_;
      auVar45._12_4_ = -auVar116._12_4_ * auVar110._12_4_;
      auVar45._16_4_ = -fVar209 * auVar110._16_4_;
      auVar45._20_4_ = -fVar196 * auVar110._20_4_;
      auVar45._24_4_ = -fVar174 * auVar110._24_4_;
      auVar45._28_4_ = auVar106._28_4_;
      auVar110 = vmulps_avx512vl(auVar110,auVar112);
      auVar88 = vfmadd213ps_fma(auVar41,auVar95,auVar104);
      auVar87 = vfmadd213ps_fma(auVar42,auVar95,auVar111);
      auVar106 = vfmadd213ps_avx512vl(auVar109,auVar95,auVar108);
      auVar105 = vfmadd213ps_avx512vl(auVar44,ZEXT1632(auVar12),ZEXT1632(auVar10));
      auVar89 = vfnmadd213ps_fma(auVar41,auVar95,auVar104);
      auVar103 = ZEXT1632(auVar12);
      auVar92 = vfmadd213ps_fma(auVar45,auVar103,ZEXT1632(auVar11));
      auVar90 = vfnmadd213ps_fma(auVar42,auVar95,auVar111);
      auVar7 = vfmadd213ps_fma(auVar110,auVar103,auVar107);
      auVar102 = vfnmadd231ps_avx512vl(auVar108,auVar95,auVar109);
      auVar10 = vfnmadd213ps_fma(auVar44,auVar103,ZEXT1632(auVar10));
      auVar11 = vfnmadd213ps_fma(auVar45,auVar103,ZEXT1632(auVar11));
      auVar175 = vfnmadd231ps_fma(auVar107,ZEXT1632(auVar12),auVar110);
      auVar110 = vsubps_avx512vl(auVar105,ZEXT1632(auVar89));
      auVar109 = vsubps_avx(ZEXT1632(auVar92),ZEXT1632(auVar90));
      auVar107 = vsubps_avx512vl(ZEXT1632(auVar7),auVar102);
      auVar108 = vmulps_avx512vl(auVar109,auVar102);
      auVar8 = vfmsub231ps_fma(auVar108,ZEXT1632(auVar90),auVar107);
      auVar46._4_4_ = auVar89._4_4_ * auVar107._4_4_;
      auVar46._0_4_ = auVar89._0_4_ * auVar107._0_4_;
      auVar46._8_4_ = auVar89._8_4_ * auVar107._8_4_;
      auVar46._12_4_ = auVar89._12_4_ * auVar107._12_4_;
      auVar46._16_4_ = auVar107._16_4_ * 0.0;
      auVar46._20_4_ = auVar107._20_4_ * 0.0;
      auVar46._24_4_ = auVar107._24_4_ * 0.0;
      auVar46._28_4_ = auVar107._28_4_;
      auVar107 = vfmsub231ps_avx512vl(auVar46,auVar102,auVar110);
      auVar47._4_4_ = auVar90._4_4_ * auVar110._4_4_;
      auVar47._0_4_ = auVar90._0_4_ * auVar110._0_4_;
      auVar47._8_4_ = auVar90._8_4_ * auVar110._8_4_;
      auVar47._12_4_ = auVar90._12_4_ * auVar110._12_4_;
      auVar47._16_4_ = auVar110._16_4_ * 0.0;
      auVar47._20_4_ = auVar110._20_4_ * 0.0;
      auVar47._24_4_ = auVar110._24_4_ * 0.0;
      auVar47._28_4_ = auVar110._28_4_;
      auVar9 = vfmsub231ps_fma(auVar47,ZEXT1632(auVar89),auVar109);
      auVar109 = vfmadd231ps_avx512vl(ZEXT1632(auVar9),auVar112,auVar107);
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar112,ZEXT1632(auVar8));
      auVar113 = ZEXT1632(auVar91);
      uVar80 = vcmpps_avx512vl(auVar109,auVar113,2);
      bVar73 = (byte)uVar80;
      fVar85 = (float)((uint)(bVar73 & 1) * auVar88._0_4_ |
                      (uint)!(bool)(bVar73 & 1) * auVar10._0_4_);
      bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
      fVar139 = (float)((uint)bVar16 * auVar88._4_4_ | (uint)!bVar16 * auVar10._4_4_);
      bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
      fVar141 = (float)((uint)bVar16 * auVar88._8_4_ | (uint)!bVar16 * auVar10._8_4_);
      bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
      fVar144 = (float)((uint)bVar16 * auVar88._12_4_ | (uint)!bVar16 * auVar10._12_4_);
      auVar108 = ZEXT1632(CONCAT412(fVar144,CONCAT48(fVar141,CONCAT44(fVar139,fVar85))));
      fVar86 = (float)((uint)(bVar73 & 1) * auVar87._0_4_ |
                      (uint)!(bool)(bVar73 & 1) * auVar11._0_4_);
      bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
      fVar140 = (float)((uint)bVar16 * auVar87._4_4_ | (uint)!bVar16 * auVar11._4_4_);
      bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
      fVar142 = (float)((uint)bVar16 * auVar87._8_4_ | (uint)!bVar16 * auVar11._8_4_);
      bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
      fVar145 = (float)((uint)bVar16 * auVar87._12_4_ | (uint)!bVar16 * auVar11._12_4_);
      auVar103 = ZEXT1632(CONCAT412(fVar145,CONCAT48(fVar142,CONCAT44(fVar140,fVar86))));
      auVar118._0_4_ =
           (float)((uint)(bVar73 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar175._0_4_)
      ;
      bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
      auVar118._4_4_ = (float)((uint)bVar16 * auVar106._4_4_ | (uint)!bVar16 * auVar175._4_4_);
      bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
      auVar118._8_4_ = (float)((uint)bVar16 * auVar106._8_4_ | (uint)!bVar16 * auVar175._8_4_);
      bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar118._12_4_ = (float)((uint)bVar16 * auVar106._12_4_ | (uint)!bVar16 * auVar175._12_4_);
      fVar195 = (float)((uint)((byte)(uVar80 >> 4) & 1) * auVar106._16_4_);
      auVar118._16_4_ = fVar195;
      fVar208 = (float)((uint)((byte)(uVar80 >> 5) & 1) * auVar106._20_4_);
      auVar118._20_4_ = fVar208;
      fVar163 = (float)((uint)((byte)(uVar80 >> 6) & 1) * auVar106._24_4_);
      auVar118._24_4_ = fVar163;
      iVar1 = (uint)(byte)(uVar80 >> 7) * auVar106._28_4_;
      auVar118._28_4_ = iVar1;
      auVar110 = vblendmps_avx512vl(ZEXT1632(auVar89),auVar105);
      auVar119._0_4_ =
           (uint)(bVar73 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar8._0_4_;
      bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
      auVar119._4_4_ = (uint)bVar16 * auVar110._4_4_ | (uint)!bVar16 * auVar8._4_4_;
      bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
      auVar119._8_4_ = (uint)bVar16 * auVar110._8_4_ | (uint)!bVar16 * auVar8._8_4_;
      bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar119._12_4_ = (uint)bVar16 * auVar110._12_4_ | (uint)!bVar16 * auVar8._12_4_;
      auVar119._16_4_ = (uint)((byte)(uVar80 >> 4) & 1) * auVar110._16_4_;
      auVar119._20_4_ = (uint)((byte)(uVar80 >> 5) & 1) * auVar110._20_4_;
      auVar119._24_4_ = (uint)((byte)(uVar80 >> 6) & 1) * auVar110._24_4_;
      auVar119._28_4_ = (uint)(byte)(uVar80 >> 7) * auVar110._28_4_;
      auVar110 = vblendmps_avx512vl(ZEXT1632(auVar90),ZEXT1632(auVar92));
      auVar120._0_4_ =
           (float)((uint)(bVar73 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar87._0_4_);
      bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
      auVar120._4_4_ = (float)((uint)bVar16 * auVar110._4_4_ | (uint)!bVar16 * auVar87._4_4_);
      bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
      auVar120._8_4_ = (float)((uint)bVar16 * auVar110._8_4_ | (uint)!bVar16 * auVar87._8_4_);
      bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar120._12_4_ = (float)((uint)bVar16 * auVar110._12_4_ | (uint)!bVar16 * auVar87._12_4_);
      fVar196 = (float)((uint)((byte)(uVar80 >> 4) & 1) * auVar110._16_4_);
      auVar120._16_4_ = fVar196;
      fVar209 = (float)((uint)((byte)(uVar80 >> 5) & 1) * auVar110._20_4_);
      auVar120._20_4_ = fVar209;
      fVar174 = (float)((uint)((byte)(uVar80 >> 6) & 1) * auVar110._24_4_);
      auVar120._24_4_ = fVar174;
      auVar120._28_4_ = (uint)(byte)(uVar80 >> 7) * auVar110._28_4_;
      auVar110 = vblendmps_avx512vl(auVar102,ZEXT1632(auVar7));
      auVar121._0_4_ =
           (float)((uint)(bVar73 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar106._0_4_)
      ;
      bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
      auVar121._4_4_ = (float)((uint)bVar16 * auVar110._4_4_ | (uint)!bVar16 * auVar106._4_4_);
      bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
      auVar121._8_4_ = (float)((uint)bVar16 * auVar110._8_4_ | (uint)!bVar16 * auVar106._8_4_);
      bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar121._12_4_ = (float)((uint)bVar16 * auVar110._12_4_ | (uint)!bVar16 * auVar106._12_4_);
      bVar16 = (bool)((byte)(uVar80 >> 4) & 1);
      auVar121._16_4_ = (float)((uint)bVar16 * auVar110._16_4_ | (uint)!bVar16 * auVar106._16_4_);
      bVar16 = (bool)((byte)(uVar80 >> 5) & 1);
      auVar121._20_4_ = (float)((uint)bVar16 * auVar110._20_4_ | (uint)!bVar16 * auVar106._20_4_);
      bVar16 = (bool)((byte)(uVar80 >> 6) & 1);
      auVar121._24_4_ = (float)((uint)bVar16 * auVar110._24_4_ | (uint)!bVar16 * auVar106._24_4_);
      bVar16 = SUB81(uVar80 >> 7,0);
      auVar121._28_4_ = (uint)bVar16 * auVar110._28_4_ | (uint)!bVar16 * auVar106._28_4_;
      auVar122._0_4_ =
           (uint)(bVar73 & 1) * (int)auVar89._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar105._0_4_;
      bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
      auVar122._4_4_ = (uint)bVar16 * (int)auVar89._4_4_ | (uint)!bVar16 * auVar105._4_4_;
      bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
      auVar122._8_4_ = (uint)bVar16 * (int)auVar89._8_4_ | (uint)!bVar16 * auVar105._8_4_;
      bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar122._12_4_ = (uint)bVar16 * (int)auVar89._12_4_ | (uint)!bVar16 * auVar105._12_4_;
      auVar122._16_4_ = (uint)!(bool)((byte)(uVar80 >> 4) & 1) * auVar105._16_4_;
      auVar122._20_4_ = (uint)!(bool)((byte)(uVar80 >> 5) & 1) * auVar105._20_4_;
      auVar122._24_4_ = (uint)!(bool)((byte)(uVar80 >> 6) & 1) * auVar105._24_4_;
      auVar122._28_4_ = (uint)!SUB81(uVar80 >> 7,0) * auVar105._28_4_;
      bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
      bVar18 = (bool)((byte)(uVar80 >> 2) & 1);
      bVar19 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar123._0_4_ =
           (uint)(bVar73 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar7._0_4_;
      bVar17 = (bool)((byte)(uVar80 >> 1) & 1);
      auVar123._4_4_ = (uint)bVar17 * auVar102._4_4_ | (uint)!bVar17 * auVar7._4_4_;
      bVar17 = (bool)((byte)(uVar80 >> 2) & 1);
      auVar123._8_4_ = (uint)bVar17 * auVar102._8_4_ | (uint)!bVar17 * auVar7._8_4_;
      bVar17 = (bool)((byte)(uVar80 >> 3) & 1);
      auVar123._12_4_ = (uint)bVar17 * auVar102._12_4_ | (uint)!bVar17 * auVar7._12_4_;
      auVar123._16_4_ = (uint)((byte)(uVar80 >> 4) & 1) * auVar102._16_4_;
      auVar123._20_4_ = (uint)((byte)(uVar80 >> 5) & 1) * auVar102._20_4_;
      auVar123._24_4_ = (uint)((byte)(uVar80 >> 6) & 1) * auVar102._24_4_;
      iVar2 = (uint)(byte)(uVar80 >> 7) * auVar102._28_4_;
      auVar123._28_4_ = iVar2;
      auVar104 = vsubps_avx512vl(auVar122,auVar108);
      auVar110 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar90._12_4_ |
                                               (uint)!bVar19 * auVar92._12_4_,
                                               CONCAT48((uint)bVar18 * (int)auVar90._8_4_ |
                                                        (uint)!bVar18 * auVar92._8_4_,
                                                        CONCAT44((uint)bVar16 * (int)auVar90._4_4_ |
                                                                 (uint)!bVar16 * auVar92._4_4_,
                                                                 (uint)(bVar73 & 1) *
                                                                 (int)auVar90._0_4_ |
                                                                 (uint)!(bool)(bVar73 & 1) *
                                                                 auVar92._0_4_)))),auVar103);
      auVar192 = ZEXT3264(auVar110);
      auVar106 = vsubps_avx(auVar123,auVar118);
      auVar105 = vsubps_avx(auVar108,auVar119);
      auVar193 = ZEXT3264(auVar105);
      auVar102 = vsubps_avx(auVar103,auVar120);
      auVar107 = vsubps_avx(auVar118,auVar121);
      auVar48._4_4_ = auVar106._4_4_ * fVar139;
      auVar48._0_4_ = auVar106._0_4_ * fVar85;
      auVar48._8_4_ = auVar106._8_4_ * fVar141;
      auVar48._12_4_ = auVar106._12_4_ * fVar144;
      auVar48._16_4_ = auVar106._16_4_ * 0.0;
      auVar48._20_4_ = auVar106._20_4_ * 0.0;
      auVar48._24_4_ = auVar106._24_4_ * 0.0;
      auVar48._28_4_ = iVar2;
      auVar88 = vfmsub231ps_fma(auVar48,auVar118,auVar104);
      auVar49._4_4_ = fVar140 * auVar104._4_4_;
      auVar49._0_4_ = fVar86 * auVar104._0_4_;
      auVar49._8_4_ = fVar142 * auVar104._8_4_;
      auVar49._12_4_ = fVar145 * auVar104._12_4_;
      auVar49._16_4_ = auVar104._16_4_ * 0.0;
      auVar49._20_4_ = auVar104._20_4_ * 0.0;
      auVar49._24_4_ = auVar104._24_4_ * 0.0;
      auVar49._28_4_ = auVar109._28_4_;
      auVar87 = vfmsub231ps_fma(auVar49,auVar108,auVar110);
      auVar109 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),auVar113,ZEXT1632(auVar88));
      auVar187._0_4_ = auVar110._0_4_ * auVar118._0_4_;
      auVar187._4_4_ = auVar110._4_4_ * auVar118._4_4_;
      auVar187._8_4_ = auVar110._8_4_ * auVar118._8_4_;
      auVar187._12_4_ = auVar110._12_4_ * auVar118._12_4_;
      auVar187._16_4_ = auVar110._16_4_ * fVar195;
      auVar187._20_4_ = auVar110._20_4_ * fVar208;
      auVar187._24_4_ = auVar110._24_4_ * fVar163;
      auVar187._28_4_ = 0;
      auVar88 = vfmsub231ps_fma(auVar187,auVar103,auVar106);
      auVar111 = vfmadd231ps_avx512vl(auVar109,auVar113,ZEXT1632(auVar88));
      auVar109 = vmulps_avx512vl(auVar107,auVar119);
      auVar109 = vfmsub231ps_avx512vl(auVar109,auVar105,auVar121);
      auVar50._4_4_ = auVar102._4_4_ * auVar121._4_4_;
      auVar50._0_4_ = auVar102._0_4_ * auVar121._0_4_;
      auVar50._8_4_ = auVar102._8_4_ * auVar121._8_4_;
      auVar50._12_4_ = auVar102._12_4_ * auVar121._12_4_;
      auVar50._16_4_ = auVar102._16_4_ * auVar121._16_4_;
      auVar50._20_4_ = auVar102._20_4_ * auVar121._20_4_;
      auVar50._24_4_ = auVar102._24_4_ * auVar121._24_4_;
      auVar50._28_4_ = auVar121._28_4_;
      auVar88 = vfmsub231ps_fma(auVar50,auVar120,auVar107);
      auVar188._0_4_ = auVar120._0_4_ * auVar105._0_4_;
      auVar188._4_4_ = auVar120._4_4_ * auVar105._4_4_;
      auVar188._8_4_ = auVar120._8_4_ * auVar105._8_4_;
      auVar188._12_4_ = auVar120._12_4_ * auVar105._12_4_;
      auVar188._16_4_ = fVar196 * auVar105._16_4_;
      auVar188._20_4_ = fVar209 * auVar105._20_4_;
      auVar188._24_4_ = fVar174 * auVar105._24_4_;
      auVar188._28_4_ = 0;
      auVar87 = vfmsub231ps_fma(auVar188,auVar102,auVar119);
      auVar109 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),auVar113,auVar109);
      auVar112 = vfmadd231ps_avx512vl(auVar109,auVar113,ZEXT1632(auVar88));
      auVar191 = ZEXT3264(auVar112);
      auVar109 = vmaxps_avx(auVar111,auVar112);
      uVar158 = vcmpps_avx512vl(auVar109,auVar113,2);
      bVar82 = bVar82 & (byte)uVar158;
      if (bVar82 != 0) {
        auVar51._4_4_ = auVar107._4_4_ * auVar110._4_4_;
        auVar51._0_4_ = auVar107._0_4_ * auVar110._0_4_;
        auVar51._8_4_ = auVar107._8_4_ * auVar110._8_4_;
        auVar51._12_4_ = auVar107._12_4_ * auVar110._12_4_;
        auVar51._16_4_ = auVar107._16_4_ * auVar110._16_4_;
        auVar51._20_4_ = auVar107._20_4_ * auVar110._20_4_;
        auVar51._24_4_ = auVar107._24_4_ * auVar110._24_4_;
        auVar51._28_4_ = auVar109._28_4_;
        auVar7 = vfmsub231ps_fma(auVar51,auVar102,auVar106);
        auVar52._4_4_ = auVar106._4_4_ * auVar105._4_4_;
        auVar52._0_4_ = auVar106._0_4_ * auVar105._0_4_;
        auVar52._8_4_ = auVar106._8_4_ * auVar105._8_4_;
        auVar52._12_4_ = auVar106._12_4_ * auVar105._12_4_;
        auVar52._16_4_ = auVar106._16_4_ * auVar105._16_4_;
        auVar52._20_4_ = auVar106._20_4_ * auVar105._20_4_;
        auVar52._24_4_ = auVar106._24_4_ * auVar105._24_4_;
        auVar52._28_4_ = auVar106._28_4_;
        auVar92 = vfmsub231ps_fma(auVar52,auVar104,auVar107);
        auVar53._4_4_ = auVar102._4_4_ * auVar104._4_4_;
        auVar53._0_4_ = auVar102._0_4_ * auVar104._0_4_;
        auVar53._8_4_ = auVar102._8_4_ * auVar104._8_4_;
        auVar53._12_4_ = auVar102._12_4_ * auVar104._12_4_;
        auVar53._16_4_ = auVar102._16_4_ * auVar104._16_4_;
        auVar53._20_4_ = auVar102._20_4_ * auVar104._20_4_;
        auVar53._24_4_ = auVar102._24_4_ * auVar104._24_4_;
        auVar53._28_4_ = auVar102._28_4_;
        auVar8 = vfmsub231ps_fma(auVar53,auVar105,auVar110);
        auVar88 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar92),ZEXT1632(auVar8));
        auVar87 = vfmadd231ps_fma(ZEXT1632(auVar88),ZEXT1632(auVar7),ZEXT1232(ZEXT412(0)) << 0x20);
        auVar109 = vrcp14ps_avx512vl(ZEXT1632(auVar87));
        auVar29._8_4_ = 0x3f800000;
        auVar29._0_8_ = 0x3f8000003f800000;
        auVar29._12_4_ = 0x3f800000;
        auVar29._16_4_ = 0x3f800000;
        auVar29._20_4_ = 0x3f800000;
        auVar29._24_4_ = 0x3f800000;
        auVar29._28_4_ = 0x3f800000;
        auVar110 = vfnmadd213ps_avx512vl(auVar109,ZEXT1632(auVar87),auVar29);
        auVar88 = vfmadd132ps_fma(auVar110,auVar109,auVar109);
        auVar192 = ZEXT1664(auVar88);
        auVar54._4_4_ = auVar8._4_4_ * auVar118._4_4_;
        auVar54._0_4_ = auVar8._0_4_ * auVar118._0_4_;
        auVar54._8_4_ = auVar8._8_4_ * auVar118._8_4_;
        auVar54._12_4_ = auVar8._12_4_ * auVar118._12_4_;
        auVar54._16_4_ = fVar195 * 0.0;
        auVar54._20_4_ = fVar208 * 0.0;
        auVar54._24_4_ = fVar163 * 0.0;
        auVar54._28_4_ = iVar1;
        auVar92 = vfmadd231ps_fma(auVar54,auVar103,ZEXT1632(auVar92));
        auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar108,ZEXT1632(auVar7));
        fVar195 = auVar88._0_4_;
        fVar208 = auVar88._4_4_;
        fVar209 = auVar88._8_4_;
        fVar196 = auVar88._12_4_;
        local_260._28_4_ = auVar109._28_4_;
        local_260._0_28_ =
             ZEXT1628(CONCAT412(auVar92._12_4_ * fVar196,
                                CONCAT48(auVar92._8_4_ * fVar209,
                                         CONCAT44(auVar92._4_4_ * fVar208,auVar92._0_4_ * fVar195)))
                     );
        auVar193 = ZEXT3264(local_260);
        auVar151._8_4_ = 3;
        auVar151._0_8_ = 0x300000003;
        auVar151._12_4_ = 3;
        auVar151._16_4_ = 3;
        auVar151._20_4_ = 3;
        auVar151._24_4_ = 3;
        auVar151._28_4_ = 3;
        auVar109 = vpermps_avx2(auVar151,ZEXT1632((undefined1  [16])aVar4));
        uVar158 = vcmpps_avx512vl(auVar109,local_260,2);
        fVar163 = (local_540->super_RayK<1>).tfar;
        auVar30._4_4_ = fVar163;
        auVar30._0_4_ = fVar163;
        auVar30._8_4_ = fVar163;
        auVar30._12_4_ = fVar163;
        auVar30._16_4_ = fVar163;
        auVar30._20_4_ = fVar163;
        auVar30._24_4_ = fVar163;
        auVar30._28_4_ = fVar163;
        uVar23 = vcmpps_avx512vl(local_260,auVar30,2);
        bVar82 = (byte)uVar158 & (byte)uVar23 & bVar82;
        if (bVar82 != 0) {
          uVar84 = vcmpps_avx512vl(ZEXT1632(auVar87),ZEXT1232(ZEXT412(0)) << 0x20,4);
          uVar84 = bVar82 & uVar84;
          if ((char)uVar84 != '\0') {
            fVar163 = auVar111._0_4_ * fVar195;
            fVar174 = auVar111._4_4_ * fVar208;
            auVar55._4_4_ = fVar174;
            auVar55._0_4_ = fVar163;
            fVar85 = auVar111._8_4_ * fVar209;
            auVar55._8_4_ = fVar85;
            fVar86 = auVar111._12_4_ * fVar196;
            auVar55._12_4_ = fVar86;
            fVar139 = auVar111._16_4_ * 0.0;
            auVar55._16_4_ = fVar139;
            fVar140 = auVar111._20_4_ * 0.0;
            auVar55._20_4_ = fVar140;
            fVar141 = auVar111._24_4_ * 0.0;
            auVar55._24_4_ = fVar141;
            auVar55._28_4_ = auVar111._28_4_;
            auVar152._8_4_ = 0x3f800000;
            auVar152._0_8_ = 0x3f8000003f800000;
            auVar152._12_4_ = 0x3f800000;
            auVar152._16_4_ = 0x3f800000;
            auVar152._20_4_ = 0x3f800000;
            auVar152._24_4_ = 0x3f800000;
            auVar152._28_4_ = 0x3f800000;
            auVar109 = vsubps_avx(auVar152,auVar55);
            local_2a0._0_4_ =
                 (float)((uint)(bVar73 & 1) * (int)fVar163 |
                        (uint)!(bool)(bVar73 & 1) * auVar109._0_4_);
            bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
            local_2a0._4_4_ = (float)((uint)bVar16 * (int)fVar174 | (uint)!bVar16 * auVar109._4_4_);
            bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
            local_2a0._8_4_ = (float)((uint)bVar16 * (int)fVar85 | (uint)!bVar16 * auVar109._8_4_);
            bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
            local_2a0._12_4_ = (float)((uint)bVar16 * (int)fVar86 | (uint)!bVar16 * auVar109._12_4_)
            ;
            bVar16 = (bool)((byte)(uVar80 >> 4) & 1);
            local_2a0._16_4_ =
                 (float)((uint)bVar16 * (int)fVar139 | (uint)!bVar16 * auVar109._16_4_);
            bVar16 = (bool)((byte)(uVar80 >> 5) & 1);
            local_2a0._20_4_ =
                 (float)((uint)bVar16 * (int)fVar140 | (uint)!bVar16 * auVar109._20_4_);
            bVar16 = (bool)((byte)(uVar80 >> 6) & 1);
            local_2a0._24_4_ =
                 (float)((uint)bVar16 * (int)fVar141 | (uint)!bVar16 * auVar109._24_4_);
            bVar16 = SUB81(uVar80 >> 7,0);
            local_2a0._28_4_ =
                 (float)((uint)bVar16 * auVar111._28_4_ | (uint)!bVar16 * auVar109._28_4_);
            auVar109 = vsubps_avx(ZEXT1632(auVar12),auVar95);
            auVar88 = vfmadd213ps_fma(auVar109,local_2a0,auVar95);
            fVar163 = local_518->depth_scale;
            auVar31._4_4_ = fVar163;
            auVar31._0_4_ = fVar163;
            auVar31._8_4_ = fVar163;
            auVar31._12_4_ = fVar163;
            auVar31._16_4_ = fVar163;
            auVar31._20_4_ = fVar163;
            auVar31._24_4_ = fVar163;
            auVar31._28_4_ = fVar163;
            auVar109 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar88._12_4_ + auVar88._12_4_,
                                                          CONCAT48(auVar88._8_4_ + auVar88._8_4_,
                                                                   CONCAT44(auVar88._4_4_ +
                                                                            auVar88._4_4_,
                                                                            auVar88._0_4_ +
                                                                            auVar88._0_4_)))),
                                       auVar31);
            uVar22 = vcmpps_avx512vl(local_260,auVar109,6);
            uVar84 = uVar84 & uVar22;
            bVar82 = (byte)uVar84;
            if (bVar82 != 0) {
              auVar172._0_4_ = auVar112._0_4_ * fVar195;
              auVar172._4_4_ = auVar112._4_4_ * fVar208;
              auVar172._8_4_ = auVar112._8_4_ * fVar209;
              auVar172._12_4_ = auVar112._12_4_ * fVar196;
              auVar172._16_4_ = auVar112._16_4_ * 0.0;
              auVar172._20_4_ = auVar112._20_4_ * 0.0;
              auVar172._24_4_ = auVar112._24_4_ * 0.0;
              auVar172._28_4_ = 0;
              auVar176._8_4_ = 0x3f800000;
              auVar176._0_8_ = 0x3f8000003f800000;
              auVar176._12_4_ = 0x3f800000;
              auVar176._16_4_ = 0x3f800000;
              auVar176._20_4_ = 0x3f800000;
              auVar176._24_4_ = 0x3f800000;
              auVar176._28_4_ = 0x3f800000;
              auVar109 = vsubps_avx(auVar176,auVar172);
              auVar124._0_4_ =
                   (uint)(bVar73 & 1) * (int)auVar172._0_4_ |
                   (uint)!(bool)(bVar73 & 1) * auVar109._0_4_;
              bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
              auVar124._4_4_ = (uint)bVar16 * (int)auVar172._4_4_ | (uint)!bVar16 * auVar109._4_4_;
              bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
              auVar124._8_4_ = (uint)bVar16 * (int)auVar172._8_4_ | (uint)!bVar16 * auVar109._8_4_;
              bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
              auVar124._12_4_ =
                   (uint)bVar16 * (int)auVar172._12_4_ | (uint)!bVar16 * auVar109._12_4_;
              bVar16 = (bool)((byte)(uVar80 >> 4) & 1);
              auVar124._16_4_ =
                   (uint)bVar16 * (int)auVar172._16_4_ | (uint)!bVar16 * auVar109._16_4_;
              bVar16 = (bool)((byte)(uVar80 >> 5) & 1);
              auVar124._20_4_ =
                   (uint)bVar16 * (int)auVar172._20_4_ | (uint)!bVar16 * auVar109._20_4_;
              bVar16 = (bool)((byte)(uVar80 >> 6) & 1);
              auVar124._24_4_ =
                   (uint)bVar16 * (int)auVar172._24_4_ | (uint)!bVar16 * auVar109._24_4_;
              auVar124._28_4_ = (uint)!SUB81(uVar80 >> 7,0) * auVar109._28_4_;
              auVar32._8_4_ = 0x40000000;
              auVar32._0_8_ = 0x4000000040000000;
              auVar32._12_4_ = 0x40000000;
              auVar32._16_4_ = 0x40000000;
              auVar32._20_4_ = 0x40000000;
              auVar32._24_4_ = 0x40000000;
              auVar32._28_4_ = 0x40000000;
              local_280 = vfmsub132ps_avx512vl(auVar124,auVar176,auVar32);
              local_240 = 0;
              local_23c = iVar13;
              local_230 = local_4b0._0_8_;
              uStack_228 = local_4b0._8_8_;
              local_220 = local_4c0._0_8_;
              uStack_218 = local_4c0._8_8_;
              local_210 = local_4d0._0_8_;
              uStack_208 = local_4d0._8_8_;
              local_200 = local_4e0;
              uStack_1f8 = uStack_4d8;
              if ((pGVar79->mask & (local_540->super_RayK<1>).mask) != 0) {
                fVar163 = 1.0 / auVar93._0_4_;
                local_1e0[0] = fVar163 * (local_2a0._0_4_ + 0.0);
                local_1e0[1] = fVar163 * (local_2a0._4_4_ + 1.0);
                local_1e0[2] = fVar163 * (local_2a0._8_4_ + 2.0);
                local_1e0[3] = fVar163 * (local_2a0._12_4_ + 3.0);
                fStack_1d0 = fVar163 * (local_2a0._16_4_ + 4.0);
                fStack_1cc = fVar163 * (local_2a0._20_4_ + 5.0);
                fStack_1c8 = fVar163 * (local_2a0._24_4_ + 6.0);
                fStack_1c4 = local_2a0._28_4_ + 7.0;
                local_1c0 = local_280;
                local_1a0 = local_260;
                auVar153._8_4_ = 0x7f800000;
                auVar153._0_8_ = 0x7f8000007f800000;
                auVar153._12_4_ = 0x7f800000;
                auVar153._16_4_ = 0x7f800000;
                auVar153._20_4_ = 0x7f800000;
                auVar153._24_4_ = 0x7f800000;
                auVar153._28_4_ = 0x7f800000;
                auVar109 = vblendmps_avx512vl(auVar153,local_260);
                auVar125._0_4_ =
                     (uint)(bVar82 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar82 & 1) * 0x7f800000;
                bVar16 = (bool)((byte)(uVar84 >> 1) & 1);
                auVar125._4_4_ = (uint)bVar16 * auVar109._4_4_ | (uint)!bVar16 * 0x7f800000;
                bVar16 = (bool)((byte)(uVar84 >> 2) & 1);
                auVar125._8_4_ = (uint)bVar16 * auVar109._8_4_ | (uint)!bVar16 * 0x7f800000;
                bVar16 = (bool)((byte)(uVar84 >> 3) & 1);
                auVar125._12_4_ = (uint)bVar16 * auVar109._12_4_ | (uint)!bVar16 * 0x7f800000;
                bVar16 = (bool)((byte)(uVar84 >> 4) & 1);
                auVar125._16_4_ = (uint)bVar16 * auVar109._16_4_ | (uint)!bVar16 * 0x7f800000;
                bVar16 = (bool)((byte)(uVar84 >> 5) & 1);
                auVar125._20_4_ = (uint)bVar16 * auVar109._20_4_ | (uint)!bVar16 * 0x7f800000;
                bVar16 = (bool)((byte)(uVar84 >> 6) & 1);
                auVar125._24_4_ = (uint)bVar16 * auVar109._24_4_ | (uint)!bVar16 * 0x7f800000;
                bVar16 = SUB81(uVar84 >> 7,0);
                auVar125._28_4_ = (uint)bVar16 * auVar109._28_4_ | (uint)!bVar16 * 0x7f800000;
                auVar109 = vshufps_avx(auVar125,auVar125,0xb1);
                auVar109 = vminps_avx(auVar125,auVar109);
                auVar110 = vshufpd_avx(auVar109,auVar109,5);
                auVar109 = vminps_avx(auVar109,auVar110);
                auVar110 = vpermpd_avx2(auVar109,0x4e);
                auVar109 = vminps_avx(auVar109,auVar110);
                uVar158 = vcmpps_avx512vl(auVar125,auVar109,0);
                uVar74 = (uint)uVar84;
                if ((bVar82 & (byte)uVar158) != 0) {
                  uVar74 = (uint)(bVar82 & (byte)uVar158);
                }
                uVar24 = 0;
                for (; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x80000000) {
                  uVar24 = uVar24 + 1;
                }
                uVar80 = (ulong)uVar24;
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar79->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_3e0 = ZEXT432((uint)(local_540->super_RayK<1>).tfar);
                  local_400 = local_260;
                  local_460 = auVar94;
                  do {
                    local_494 = local_1e0[uVar80];
                    local_490 = *(undefined4 *)(local_1c0 + uVar80 * 4);
                    (ray->super_RayK<1>).tfar = *(float *)(local_1a0 + uVar80 * 4);
                    local_510.context = context->user;
                    fVar163 = 1.0 - local_494;
                    auVar28._8_4_ = 0x80000000;
                    auVar28._0_8_ = 0x8000000080000000;
                    auVar28._12_4_ = 0x80000000;
                    auVar92 = vxorps_avx512vl(ZEXT416((uint)fVar163),auVar28);
                    auVar88 = ZEXT416((uint)(local_494 * fVar163 * 4.0));
                    auVar87 = vfnmsub213ss_fma(ZEXT416((uint)local_494),ZEXT416((uint)local_494),
                                               auVar88);
                    auVar88 = vfmadd213ss_fma(ZEXT416((uint)fVar163),ZEXT416((uint)fVar163),auVar88)
                    ;
                    fVar163 = fVar163 * auVar92._0_4_ * 0.5;
                    fVar195 = auVar87._0_4_ * 0.5;
                    auVar192 = ZEXT464((uint)fVar195);
                    fVar208 = auVar88._0_4_ * 0.5;
                    fVar209 = local_494 * local_494 * 0.5;
                    auVar185._0_4_ = fVar209 * (float)local_4e0._0_4_;
                    auVar185._4_4_ = fVar209 * (float)local_4e0._4_4_;
                    auVar185._8_4_ = fVar209 * (float)uStack_4d8;
                    auVar185._12_4_ = fVar209 * uStack_4d8._4_4_;
                    auVar170._4_4_ = fVar208;
                    auVar170._0_4_ = fVar208;
                    auVar170._8_4_ = fVar208;
                    auVar170._12_4_ = fVar208;
                    auVar88 = vfmadd132ps_fma(auVar170,auVar185,local_4d0);
                    auVar186._4_4_ = fVar195;
                    auVar186._0_4_ = fVar195;
                    auVar186._8_4_ = fVar195;
                    auVar186._12_4_ = fVar195;
                    auVar88 = vfmadd132ps_fma(auVar186,auVar88,local_4c0);
                    auVar191 = ZEXT1664(auVar88);
                    auVar171._4_4_ = fVar163;
                    auVar171._0_4_ = fVar163;
                    auVar171._8_4_ = fVar163;
                    auVar171._12_4_ = fVar163;
                    auVar87 = vfmadd132ps_fma(auVar171,auVar88,local_4b0);
                    local_4a0 = vmovlps_avx(auVar87);
                    local_498 = vextractps_avx(auVar87,2);
                    local_48c = (int)local_528;
                    local_488 = (int)local_538;
                    local_484 = (local_510.context)->instID[0];
                    local_480 = (local_510.context)->instPrimID[0];
                    local_54c = -1;
                    local_510.valid = &local_54c;
                    local_510.geometryUserPtr = pGVar79->userPtr;
                    local_510.ray = (RTCRayN *)ray;
                    local_510.hit = (RTCHitN *)&local_4a0;
                    local_510.N = 1;
                    if (pGVar79->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01b392b0:
                      p_Var15 = context->args->filter;
                      if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar79->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar191 = ZEXT1664(auVar191._0_16_);
                        auVar192 = ZEXT1664(auVar192._0_16_);
                        (*p_Var15)(&local_510);
                        auVar193 = ZEXT3264(local_400);
                        auVar212 = ZEXT3264(local_460);
                        auVar215 = ZEXT464(0xbf800000);
                        auVar109 = vbroadcastss_avx512vl(ZEXT416(2));
                        auVar214 = ZEXT3264(auVar109);
                        auVar109 = vbroadcastss_avx512vl(ZEXT416(1));
                        auVar213 = ZEXT3264(auVar109);
                        ray = local_540;
                        if (*local_510.valid == 0) goto LAB_01b39365;
                      }
                      (((Vec3f *)((long)local_510.ray + 0x30))->field_0).components[0] =
                           *(float *)local_510.hit;
                      (((Vec3f *)((long)local_510.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_510.hit + 4);
                      (((Vec3f *)((long)local_510.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_510.hit + 8);
                      *(float *)((long)local_510.ray + 0x3c) = *(float *)(local_510.hit + 0xc);
                      *(float *)((long)local_510.ray + 0x40) = *(float *)(local_510.hit + 0x10);
                      *(float *)((long)local_510.ray + 0x44) = *(float *)(local_510.hit + 0x14);
                      *(float *)((long)local_510.ray + 0x48) = *(float *)(local_510.hit + 0x18);
                      *(float *)((long)local_510.ray + 0x4c) = *(float *)(local_510.hit + 0x1c);
                      *(float *)((long)local_510.ray + 0x50) = *(float *)(local_510.hit + 0x20);
                    }
                    else {
                      auVar191 = ZEXT1664(auVar88);
                      auVar192 = ZEXT464((uint)fVar195);
                      (*pGVar79->intersectionFilterN)(&local_510);
                      auVar193 = ZEXT3264(local_400);
                      auVar212 = ZEXT3264(local_460);
                      auVar215 = ZEXT464(0xbf800000);
                      auVar109 = vbroadcastss_avx512vl(ZEXT416(2));
                      auVar214 = ZEXT3264(auVar109);
                      auVar109 = vbroadcastss_avx512vl(ZEXT416(1));
                      auVar213 = ZEXT3264(auVar109);
                      ray = local_540;
                      if (*local_510.valid != 0) goto LAB_01b392b0;
LAB_01b39365:
                      auVar215 = ZEXT464(0xbf800000);
                      (local_540->super_RayK<1>).tfar = (float)local_3e0._0_4_;
                      ray = local_540;
                    }
                    auVar94 = auVar212._0_32_;
                    bVar82 = ~(byte)(1 << ((uint)uVar80 & 0x1f)) & (byte)uVar84;
                    fVar163 = (ray->super_RayK<1>).tfar;
                    auVar39._4_4_ = fVar163;
                    auVar39._0_4_ = fVar163;
                    auVar39._8_4_ = fVar163;
                    auVar39._12_4_ = fVar163;
                    auVar39._16_4_ = fVar163;
                    auVar39._20_4_ = fVar163;
                    auVar39._24_4_ = fVar163;
                    auVar39._28_4_ = fVar163;
                    uVar158 = vcmpps_avx512vl(auVar193._0_32_,auVar39,2);
                    prim = local_520;
                    if ((bVar82 & (byte)uVar158) == 0) goto LAB_01b3849a;
                    local_3e0 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                    bVar82 = bVar82 & (byte)uVar158;
                    uVar84 = (ulong)bVar82;
                    auVar157._8_4_ = 0x7f800000;
                    auVar157._0_8_ = 0x7f8000007f800000;
                    auVar157._12_4_ = 0x7f800000;
                    auVar157._16_4_ = 0x7f800000;
                    auVar157._20_4_ = 0x7f800000;
                    auVar157._24_4_ = 0x7f800000;
                    auVar157._28_4_ = 0x7f800000;
                    auVar109 = vblendmps_avx512vl(auVar157,auVar193._0_32_);
                    auVar138._0_4_ =
                         (uint)(bVar82 & 1) * auVar109._0_4_ |
                         (uint)!(bool)(bVar82 & 1) * 0x7f800000;
                    bVar16 = (bool)(bVar82 >> 1 & 1);
                    auVar138._4_4_ = (uint)bVar16 * auVar109._4_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)(bVar82 >> 2 & 1);
                    auVar138._8_4_ = (uint)bVar16 * auVar109._8_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)(bVar82 >> 3 & 1);
                    auVar138._12_4_ = (uint)bVar16 * auVar109._12_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)(bVar82 >> 4 & 1);
                    auVar138._16_4_ = (uint)bVar16 * auVar109._16_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)(bVar82 >> 5 & 1);
                    auVar138._20_4_ = (uint)bVar16 * auVar109._20_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)(bVar82 >> 6 & 1);
                    auVar138._24_4_ = (uint)bVar16 * auVar109._24_4_ | (uint)!bVar16 * 0x7f800000;
                    auVar138._28_4_ =
                         (uint)(bVar82 >> 7) * auVar109._28_4_ |
                         (uint)!(bool)(bVar82 >> 7) * 0x7f800000;
                    auVar109 = vshufps_avx(auVar138,auVar138,0xb1);
                    auVar109 = vminps_avx(auVar138,auVar109);
                    auVar110 = vshufpd_avx(auVar109,auVar109,5);
                    auVar109 = vminps_avx(auVar109,auVar110);
                    auVar110 = vpermpd_avx2(auVar109,0x4e);
                    auVar109 = vminps_avx(auVar109,auVar110);
                    uVar158 = vcmpps_avx512vl(auVar138,auVar109,0);
                    bVar73 = (byte)uVar158 & bVar82;
                    if (bVar73 != 0) {
                      bVar82 = bVar73;
                    }
                    uVar83 = 0;
                    for (uVar75 = (uint)bVar82; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x80000000
                        ) {
                      uVar83 = uVar83 + 1;
                    }
                    uVar80 = (ulong)uVar83;
                  } while( true );
                }
                fVar163 = local_1e0[uVar80];
                fVar195 = *(float *)(local_1c0 + uVar80 * 4);
                fVar208 = 1.0 - fVar163;
                auVar25._8_4_ = 0x80000000;
                auVar25._0_8_ = 0x8000000080000000;
                auVar25._12_4_ = 0x80000000;
                auVar92 = vxorps_avx512vl(ZEXT416((uint)fVar208),auVar25);
                auVar88 = ZEXT416((uint)(fVar163 * fVar208 * 4.0));
                auVar87 = vfnmsub213ss_fma(ZEXT416((uint)fVar163),ZEXT416((uint)fVar163),auVar88);
                auVar88 = vfmadd213ss_fma(ZEXT416((uint)fVar208),ZEXT416((uint)fVar208),auVar88);
                fVar208 = fVar208 * auVar92._0_4_ * 0.5;
                fVar209 = auVar87._0_4_ * 0.5;
                auVar192 = ZEXT464((uint)fVar209);
                fVar196 = auVar88._0_4_ * 0.5;
                fVar174 = fVar163 * fVar163 * 0.5;
                auVar179._0_4_ = fVar174 * (float)local_4e0._0_4_;
                auVar179._4_4_ = fVar174 * (float)local_4e0._4_4_;
                auVar179._8_4_ = fVar174 * (float)uStack_4d8;
                auVar179._12_4_ = fVar174 * uStack_4d8._4_4_;
                auVar164._4_4_ = fVar196;
                auVar164._0_4_ = fVar196;
                auVar164._8_4_ = fVar196;
                auVar164._12_4_ = fVar196;
                auVar88 = vfmadd132ps_fma(auVar164,auVar179,local_4d0);
                auVar180._4_4_ = fVar209;
                auVar180._0_4_ = fVar209;
                auVar180._8_4_ = fVar209;
                auVar180._12_4_ = fVar209;
                auVar88 = vfmadd132ps_fma(auVar180,auVar88,local_4c0);
                auVar191 = ZEXT1664(auVar88);
                auVar165._4_4_ = fVar208;
                auVar165._0_4_ = fVar208;
                auVar165._8_4_ = fVar208;
                auVar165._12_4_ = fVar208;
                (local_540->super_RayK<1>).tfar = *(float *)(local_1a0 + uVar80 * 4);
                auVar88 = vfmadd132ps_fma(auVar165,auVar88,local_4b0);
                uVar158 = vmovlps_avx(auVar88);
                *(undefined8 *)&(local_540->Ng).field_0 = uVar158;
                fVar208 = (float)vextractps_avx(auVar88,2);
                (local_540->Ng).field_0.field_0.z = fVar208;
                local_540->u = fVar163;
                local_540->v = fVar195;
                local_540->primID = uVar75;
                local_540->geomID = uVar83;
                local_540->instID[0] = context->user->instID[0];
                local_540->instPrimID[0] = context->user->instPrimID[0];
                prim = local_520;
              }
            }
          }
        }
      }
    }
LAB_01b3849a:
    if (8 < iVar13) {
      local_3e0 = vpbroadcastd_avx512vl();
      local_400._4_4_ = local_420._0_4_;
      local_400._0_4_ = local_420._0_4_;
      local_400._8_4_ = local_420._0_4_;
      local_400._12_4_ = local_420._0_4_;
      local_400._16_4_ = local_420._0_4_;
      local_400._20_4_ = local_420._0_4_;
      local_400._24_4_ = local_420._0_4_;
      local_400._28_4_ = local_420._0_4_;
      auVar154._8_4_ = 3;
      auVar154._0_8_ = 0x300000003;
      auVar154._12_4_ = 3;
      auVar154._16_4_ = 3;
      auVar154._20_4_ = 3;
      auVar154._24_4_ = 3;
      auVar154._28_4_ = 3;
      local_3c0 = vpermps_avx2(auVar154,local_3c0);
      local_120 = 1.0 / (float)local_440._0_4_;
      fStack_11c = local_120;
      fStack_118 = local_120;
      fStack_114 = local_120;
      fStack_110 = local_120;
      fStack_10c = local_120;
      fStack_108 = local_120;
      fStack_104 = local_120;
      lVar76 = 8;
      local_460 = auVar94;
      lVar78 = local_548;
LAB_01b38537:
      if (lVar76 < lVar78) {
        auVar109 = vpbroadcastd_avx512vl();
        auVar109 = vpor_avx2(auVar109,_DAT_01fb4ba0);
        uVar23 = vpcmpd_avx512vl(auVar109,local_3e0,1);
        auVar109 = *(undefined1 (*) [32])(bspline_basis0 + lVar76 * 4 + lVar81);
        auVar110 = *(undefined1 (*) [32])(lVar81 + 0x21fffac + lVar76 * 4);
        auVar106 = *(undefined1 (*) [32])(lVar81 + 0x2200430 + lVar76 * 4);
        auVar105 = *(undefined1 (*) [32])(lVar81 + 0x22008b4 + lVar76 * 4);
        auVar212._0_4_ = auVar105._0_4_ * (float)local_380._0_4_;
        auVar212._4_4_ = auVar105._4_4_ * (float)local_380._4_4_;
        auVar212._8_4_ = auVar105._8_4_ * fStack_378;
        auVar212._12_4_ = auVar105._12_4_ * fStack_374;
        auVar212._16_4_ = auVar105._16_4_ * fStack_370;
        auVar212._20_4_ = auVar105._20_4_ * fStack_36c;
        auVar212._28_36_ = auVar192._28_36_;
        auVar212._24_4_ = auVar105._24_4_ * fStack_368;
        auVar192._0_4_ = auVar105._0_4_ * (float)local_3a0._0_4_;
        auVar192._4_4_ = auVar105._4_4_ * (float)local_3a0._4_4_;
        auVar192._8_4_ = auVar105._8_4_ * fStack_398;
        auVar192._12_4_ = auVar105._12_4_ * fStack_394;
        auVar192._16_4_ = auVar105._16_4_ * fStack_390;
        auVar192._20_4_ = auVar105._20_4_ * fStack_38c;
        auVar192._28_36_ = auVar191._28_36_;
        auVar192._24_4_ = auVar105._24_4_ * fStack_388;
        auVar102 = vmulps_avx512vl(local_100,auVar105);
        auVar107 = vfmadd231ps_avx512vl(auVar212._0_32_,auVar106,local_340);
        auVar108 = vfmadd231ps_avx512vl(auVar192._0_32_,auVar106,local_360);
        auVar102 = vfmadd231ps_avx512vl(auVar102,auVar106,local_e0);
        auVar107 = vfmadd231ps_avx512vl(auVar107,auVar110,local_300);
        auVar108 = vfmadd231ps_avx512vl(auVar108,auVar110,local_320);
        auVar103 = vfmadd231ps_avx512vl(auVar102,auVar110,local_c0);
        auVar88 = vfmadd231ps_fma(auVar107,auVar109,local_2c0);
        auVar192 = ZEXT1664(auVar88);
        auVar87 = vfmadd231ps_fma(auVar108,auVar109,local_2e0);
        auVar191 = ZEXT1664(auVar87);
        auVar102 = *(undefined1 (*) [32])(bspline_basis1 + lVar76 * 4 + lVar81);
        auVar107 = *(undefined1 (*) [32])(lVar81 + 0x22023cc + lVar76 * 4);
        auVar112 = vfmadd231ps_avx512vl(auVar103,auVar109,local_a0);
        auVar108 = *(undefined1 (*) [32])(lVar81 + 0x2202850 + lVar76 * 4);
        auVar103 = *(undefined1 (*) [32])(lVar81 + 0x2202cd4 + lVar76 * 4);
        auVar194._0_4_ = auVar103._0_4_ * (float)local_380._0_4_;
        auVar194._4_4_ = auVar103._4_4_ * (float)local_380._4_4_;
        auVar194._8_4_ = auVar103._8_4_ * fStack_378;
        auVar194._12_4_ = auVar103._12_4_ * fStack_374;
        auVar194._16_4_ = auVar103._16_4_ * fStack_370;
        auVar194._20_4_ = auVar103._20_4_ * fStack_36c;
        auVar194._28_36_ = auVar193._28_36_;
        auVar194._24_4_ = auVar103._24_4_ * fStack_368;
        auVar56._4_4_ = auVar103._4_4_ * (float)local_3a0._4_4_;
        auVar56._0_4_ = auVar103._0_4_ * (float)local_3a0._0_4_;
        auVar56._8_4_ = auVar103._8_4_ * fStack_398;
        auVar56._12_4_ = auVar103._12_4_ * fStack_394;
        auVar56._16_4_ = auVar103._16_4_ * fStack_390;
        auVar56._20_4_ = auVar103._20_4_ * fStack_38c;
        auVar56._24_4_ = auVar103._24_4_ * fStack_388;
        auVar56._28_4_ = uStack_384;
        auVar104 = vmulps_avx512vl(local_100,auVar103);
        auVar111 = vfmadd231ps_avx512vl(auVar194._0_32_,auVar108,local_340);
        auVar113 = vfmadd231ps_avx512vl(auVar56,auVar108,local_360);
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar108,local_e0);
        auVar111 = vfmadd231ps_avx512vl(auVar111,auVar107,local_300);
        auVar113 = vfmadd231ps_avx512vl(auVar113,auVar107,local_320);
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar107,local_c0);
        auVar92 = vfmadd231ps_fma(auVar111,auVar102,local_2c0);
        auVar193 = ZEXT1664(auVar92);
        auVar7 = vfmadd231ps_fma(auVar113,auVar102,local_2e0);
        auVar113 = vfmadd231ps_avx512vl(auVar104,auVar102,local_a0);
        auVar94 = vmaxps_avx512vl(auVar112,auVar113);
        auVar104 = vsubps_avx(ZEXT1632(auVar92),ZEXT1632(auVar88));
        auVar111 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar87));
        auVar95 = vmulps_avx512vl(ZEXT1632(auVar87),auVar104);
        auVar93 = vmulps_avx512vl(ZEXT1632(auVar88),auVar111);
        auVar95 = vsubps_avx512vl(auVar95,auVar93);
        auVar93 = vmulps_avx512vl(auVar111,auVar111);
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar104,auVar104);
        auVar94 = vmulps_avx512vl(auVar94,auVar94);
        auVar94 = vmulps_avx512vl(auVar94,auVar93);
        auVar95 = vmulps_avx512vl(auVar95,auVar95);
        uVar158 = vcmpps_avx512vl(auVar95,auVar94,2);
        bVar82 = (byte)uVar23 & (byte)uVar158;
        if (bVar82 != 0) {
          auVar103 = vmulps_avx512vl(local_180,auVar103);
          auVar108 = vfmadd213ps_avx512vl(auVar108,local_160,auVar103);
          auVar107 = vfmadd213ps_avx512vl(auVar107,local_140,auVar108);
          auVar102 = vfmadd213ps_avx512vl(auVar102,local_460,auVar107);
          auVar105 = vmulps_avx512vl(local_180,auVar105);
          auVar106 = vfmadd213ps_avx512vl(auVar106,local_160,auVar105);
          auVar110 = vfmadd213ps_avx512vl(auVar110,local_140,auVar106);
          auVar107 = vfmadd213ps_avx512vl(auVar109,local_460,auVar110);
          auVar109 = *(undefined1 (*) [32])(lVar81 + 0x2200d38 + lVar76 * 4);
          auVar110 = *(undefined1 (*) [32])(lVar81 + 0x22011bc + lVar76 * 4);
          auVar106 = *(undefined1 (*) [32])(lVar81 + 0x2201640 + lVar76 * 4);
          auVar105 = *(undefined1 (*) [32])(lVar81 + 0x2201ac4 + lVar76 * 4);
          auVar108 = vmulps_avx512vl(_local_380,auVar105);
          auVar103 = vmulps_avx512vl(_local_3a0,auVar105);
          auVar105 = vmulps_avx512vl(local_180,auVar105);
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar106,local_340);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar106,local_360);
          auVar106 = vfmadd231ps_avx512vl(auVar105,local_160,auVar106);
          auVar105 = vfmadd231ps_avx512vl(auVar108,auVar110,local_300);
          auVar108 = vfmadd231ps_avx512vl(auVar103,auVar110,local_320);
          auVar110 = vfmadd231ps_avx512vl(auVar106,local_140,auVar110);
          auVar105 = vfmadd231ps_avx512vl(auVar105,auVar109,local_2c0);
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar109,local_2e0);
          auVar8 = vfmadd231ps_fma(auVar110,auVar109,local_460);
          auVar109 = *(undefined1 (*) [32])(lVar81 + 0x2203158 + lVar76 * 4);
          auVar110 = *(undefined1 (*) [32])(lVar81 + 0x2203a60 + lVar76 * 4);
          auVar106 = *(undefined1 (*) [32])(lVar81 + 0x2203ee4 + lVar76 * 4);
          auVar103 = vmulps_avx512vl(_local_380,auVar106);
          auVar94 = vmulps_avx512vl(_local_3a0,auVar106);
          auVar106 = vmulps_avx512vl(local_180,auVar106);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar110,local_340);
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar110,local_360);
          auVar106 = vfmadd231ps_avx512vl(auVar106,local_160,auVar110);
          auVar215 = ZEXT1664(auVar215._0_16_);
          auVar110 = vbroadcastss_avx512vl(ZEXT416(2));
          auVar214 = ZEXT3264(auVar110);
          auVar110 = *(undefined1 (*) [32])(lVar81 + 0x22035dc + lVar76 * 4);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar110,local_300);
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar110,local_320);
          auVar110 = vfmadd231ps_avx512vl(auVar106,local_140,auVar110);
          auVar106 = vfmadd231ps_avx512vl(auVar103,auVar109,local_2c0);
          auVar103 = vfmadd231ps_avx512vl(auVar94,auVar109,local_2e0);
          auVar110 = vfmadd231ps_avx512vl(auVar110,local_460,auVar109);
          auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar105,auVar94);
          vandps_avx512vl(auVar108,auVar94);
          auVar109 = vmaxps_avx(auVar94,auVar94);
          vandps_avx512vl(ZEXT1632(auVar8),auVar94);
          auVar109 = vmaxps_avx(auVar109,auVar94);
          uVar80 = vcmpps_avx512vl(auVar109,local_400,1);
          bVar16 = (bool)((byte)uVar80 & 1);
          auVar126._0_4_ = (float)((uint)bVar16 * auVar104._0_4_ | (uint)!bVar16 * auVar105._0_4_);
          bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
          auVar126._4_4_ = (float)((uint)bVar16 * auVar104._4_4_ | (uint)!bVar16 * auVar105._4_4_);
          bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
          auVar126._8_4_ = (float)((uint)bVar16 * auVar104._8_4_ | (uint)!bVar16 * auVar105._8_4_);
          bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
          auVar126._12_4_ =
               (float)((uint)bVar16 * auVar104._12_4_ | (uint)!bVar16 * auVar105._12_4_);
          bVar16 = (bool)((byte)(uVar80 >> 4) & 1);
          auVar126._16_4_ =
               (float)((uint)bVar16 * auVar104._16_4_ | (uint)!bVar16 * auVar105._16_4_);
          bVar16 = (bool)((byte)(uVar80 >> 5) & 1);
          auVar126._20_4_ =
               (float)((uint)bVar16 * auVar104._20_4_ | (uint)!bVar16 * auVar105._20_4_);
          bVar16 = (bool)((byte)(uVar80 >> 6) & 1);
          auVar126._24_4_ =
               (float)((uint)bVar16 * auVar104._24_4_ | (uint)!bVar16 * auVar105._24_4_);
          bVar16 = SUB81(uVar80 >> 7,0);
          auVar126._28_4_ = (uint)bVar16 * auVar104._28_4_ | (uint)!bVar16 * auVar105._28_4_;
          bVar16 = (bool)((byte)uVar80 & 1);
          auVar127._0_4_ = (float)((uint)bVar16 * auVar111._0_4_ | (uint)!bVar16 * auVar108._0_4_);
          bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
          auVar127._4_4_ = (float)((uint)bVar16 * auVar111._4_4_ | (uint)!bVar16 * auVar108._4_4_);
          bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
          auVar127._8_4_ = (float)((uint)bVar16 * auVar111._8_4_ | (uint)!bVar16 * auVar108._8_4_);
          bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
          auVar127._12_4_ =
               (float)((uint)bVar16 * auVar111._12_4_ | (uint)!bVar16 * auVar108._12_4_);
          bVar16 = (bool)((byte)(uVar80 >> 4) & 1);
          auVar127._16_4_ =
               (float)((uint)bVar16 * auVar111._16_4_ | (uint)!bVar16 * auVar108._16_4_);
          bVar16 = (bool)((byte)(uVar80 >> 5) & 1);
          auVar127._20_4_ =
               (float)((uint)bVar16 * auVar111._20_4_ | (uint)!bVar16 * auVar108._20_4_);
          bVar16 = (bool)((byte)(uVar80 >> 6) & 1);
          auVar127._24_4_ =
               (float)((uint)bVar16 * auVar111._24_4_ | (uint)!bVar16 * auVar108._24_4_);
          bVar16 = SUB81(uVar80 >> 7,0);
          auVar127._28_4_ = (uint)bVar16 * auVar111._28_4_ | (uint)!bVar16 * auVar108._28_4_;
          vandps_avx512vl(auVar106,auVar94);
          vandps_avx512vl(auVar103,auVar94);
          auVar109 = vmaxps_avx(auVar127,auVar127);
          vandps_avx512vl(auVar110,auVar94);
          auVar109 = vmaxps_avx(auVar109,auVar127);
          uVar80 = vcmpps_avx512vl(auVar109,local_400,1);
          bVar16 = (bool)((byte)uVar80 & 1);
          auVar128._0_4_ = (uint)bVar16 * auVar104._0_4_ | (uint)!bVar16 * auVar106._0_4_;
          bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
          auVar128._4_4_ = (uint)bVar16 * auVar104._4_4_ | (uint)!bVar16 * auVar106._4_4_;
          bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
          auVar128._8_4_ = (uint)bVar16 * auVar104._8_4_ | (uint)!bVar16 * auVar106._8_4_;
          bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
          auVar128._12_4_ = (uint)bVar16 * auVar104._12_4_ | (uint)!bVar16 * auVar106._12_4_;
          bVar16 = (bool)((byte)(uVar80 >> 4) & 1);
          auVar128._16_4_ = (uint)bVar16 * auVar104._16_4_ | (uint)!bVar16 * auVar106._16_4_;
          bVar16 = (bool)((byte)(uVar80 >> 5) & 1);
          auVar128._20_4_ = (uint)bVar16 * auVar104._20_4_ | (uint)!bVar16 * auVar106._20_4_;
          bVar16 = (bool)((byte)(uVar80 >> 6) & 1);
          auVar128._24_4_ = (uint)bVar16 * auVar104._24_4_ | (uint)!bVar16 * auVar106._24_4_;
          bVar16 = SUB81(uVar80 >> 7,0);
          auVar128._28_4_ = (uint)bVar16 * auVar104._28_4_ | (uint)!bVar16 * auVar106._28_4_;
          bVar16 = (bool)((byte)uVar80 & 1);
          auVar129._0_4_ = (float)((uint)bVar16 * auVar111._0_4_ | (uint)!bVar16 * auVar103._0_4_);
          bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
          auVar129._4_4_ = (float)((uint)bVar16 * auVar111._4_4_ | (uint)!bVar16 * auVar103._4_4_);
          bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
          auVar129._8_4_ = (float)((uint)bVar16 * auVar111._8_4_ | (uint)!bVar16 * auVar103._8_4_);
          bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
          auVar129._12_4_ =
               (float)((uint)bVar16 * auVar111._12_4_ | (uint)!bVar16 * auVar103._12_4_);
          bVar16 = (bool)((byte)(uVar80 >> 4) & 1);
          auVar129._16_4_ =
               (float)((uint)bVar16 * auVar111._16_4_ | (uint)!bVar16 * auVar103._16_4_);
          bVar16 = (bool)((byte)(uVar80 >> 5) & 1);
          auVar129._20_4_ =
               (float)((uint)bVar16 * auVar111._20_4_ | (uint)!bVar16 * auVar103._20_4_);
          bVar16 = (bool)((byte)(uVar80 >> 6) & 1);
          auVar129._24_4_ =
               (float)((uint)bVar16 * auVar111._24_4_ | (uint)!bVar16 * auVar103._24_4_);
          bVar16 = SUB81(uVar80 >> 7,0);
          auVar129._28_4_ = (uint)bVar16 * auVar111._28_4_ | (uint)!bVar16 * auVar103._28_4_;
          auVar199._8_4_ = 0x80000000;
          auVar199._0_8_ = 0x8000000080000000;
          auVar199._12_4_ = 0x80000000;
          auVar199._16_4_ = 0x80000000;
          auVar199._20_4_ = 0x80000000;
          auVar199._24_4_ = 0x80000000;
          auVar199._28_4_ = 0x80000000;
          auVar109 = vxorps_avx512vl(auVar128,auVar199);
          auVar89 = vxorps_avx512vl(auVar94._0_16_,auVar94._0_16_);
          auVar110 = vfmadd213ps_avx512vl(auVar126,auVar126,ZEXT1632(auVar89));
          auVar8 = vfmadd231ps_fma(auVar110,auVar127,auVar127);
          auVar110 = vrsqrt14ps_avx512vl(ZEXT1632(auVar8));
          auVar211._8_4_ = 0xbf000000;
          auVar211._0_8_ = 0xbf000000bf000000;
          auVar211._12_4_ = 0xbf000000;
          auVar211._16_4_ = 0xbf000000;
          auVar211._20_4_ = 0xbf000000;
          auVar211._24_4_ = 0xbf000000;
          auVar211._28_4_ = 0xbf000000;
          fVar163 = auVar110._0_4_;
          fVar195 = auVar110._4_4_;
          fVar208 = auVar110._8_4_;
          fVar209 = auVar110._12_4_;
          fVar196 = auVar110._16_4_;
          fVar174 = auVar110._20_4_;
          fVar85 = auVar110._24_4_;
          auVar57._4_4_ = fVar195 * fVar195 * fVar195 * auVar8._4_4_ * -0.5;
          auVar57._0_4_ = fVar163 * fVar163 * fVar163 * auVar8._0_4_ * -0.5;
          auVar57._8_4_ = fVar208 * fVar208 * fVar208 * auVar8._8_4_ * -0.5;
          auVar57._12_4_ = fVar209 * fVar209 * fVar209 * auVar8._12_4_ * -0.5;
          auVar57._16_4_ = fVar196 * fVar196 * fVar196 * -0.0;
          auVar57._20_4_ = fVar174 * fVar174 * fVar174 * -0.0;
          auVar57._24_4_ = fVar85 * fVar85 * fVar85 * -0.0;
          auVar57._28_4_ = auVar127._28_4_;
          auVar106 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar110 = vfmadd231ps_avx512vl(auVar57,auVar106,auVar110);
          auVar58._4_4_ = auVar127._4_4_ * auVar110._4_4_;
          auVar58._0_4_ = auVar127._0_4_ * auVar110._0_4_;
          auVar58._8_4_ = auVar127._8_4_ * auVar110._8_4_;
          auVar58._12_4_ = auVar127._12_4_ * auVar110._12_4_;
          auVar58._16_4_ = auVar127._16_4_ * auVar110._16_4_;
          auVar58._20_4_ = auVar127._20_4_ * auVar110._20_4_;
          auVar58._24_4_ = auVar127._24_4_ * auVar110._24_4_;
          auVar58._28_4_ = 0;
          auVar59._4_4_ = auVar110._4_4_ * -auVar126._4_4_;
          auVar59._0_4_ = auVar110._0_4_ * -auVar126._0_4_;
          auVar59._8_4_ = auVar110._8_4_ * -auVar126._8_4_;
          auVar59._12_4_ = auVar110._12_4_ * -auVar126._12_4_;
          auVar59._16_4_ = auVar110._16_4_ * -auVar126._16_4_;
          auVar59._20_4_ = auVar110._20_4_ * -auVar126._20_4_;
          auVar59._24_4_ = auVar110._24_4_ * -auVar126._24_4_;
          auVar59._28_4_ = auVar127._28_4_;
          auVar105 = vmulps_avx512vl(auVar110,ZEXT1632(auVar89));
          auVar103 = ZEXT1632(auVar89);
          auVar110 = vfmadd213ps_avx512vl(auVar128,auVar128,auVar103);
          auVar110 = vfmadd231ps_avx512vl(auVar110,auVar129,auVar129);
          auVar108 = vrsqrt14ps_avx512vl(auVar110);
          auVar110 = vmulps_avx512vl(auVar110,auVar211);
          fVar163 = auVar108._0_4_;
          fVar195 = auVar108._4_4_;
          fVar208 = auVar108._8_4_;
          fVar209 = auVar108._12_4_;
          fVar196 = auVar108._16_4_;
          fVar174 = auVar108._20_4_;
          fVar85 = auVar108._24_4_;
          auVar60._4_4_ = fVar195 * fVar195 * fVar195 * auVar110._4_4_;
          auVar60._0_4_ = fVar163 * fVar163 * fVar163 * auVar110._0_4_;
          auVar60._8_4_ = fVar208 * fVar208 * fVar208 * auVar110._8_4_;
          auVar60._12_4_ = fVar209 * fVar209 * fVar209 * auVar110._12_4_;
          auVar60._16_4_ = fVar196 * fVar196 * fVar196 * auVar110._16_4_;
          auVar60._20_4_ = fVar174 * fVar174 * fVar174 * auVar110._20_4_;
          auVar60._24_4_ = fVar85 * fVar85 * fVar85 * auVar110._24_4_;
          auVar60._28_4_ = auVar110._28_4_;
          auVar110 = vfmadd231ps_avx512vl(auVar60,auVar106,auVar108);
          auVar61._4_4_ = auVar129._4_4_ * auVar110._4_4_;
          auVar61._0_4_ = auVar129._0_4_ * auVar110._0_4_;
          auVar61._8_4_ = auVar129._8_4_ * auVar110._8_4_;
          auVar61._12_4_ = auVar129._12_4_ * auVar110._12_4_;
          auVar61._16_4_ = auVar129._16_4_ * auVar110._16_4_;
          auVar61._20_4_ = auVar129._20_4_ * auVar110._20_4_;
          auVar61._24_4_ = auVar129._24_4_ * auVar110._24_4_;
          auVar61._28_4_ = auVar108._28_4_;
          auVar62._4_4_ = auVar110._4_4_ * auVar109._4_4_;
          auVar62._0_4_ = auVar110._0_4_ * auVar109._0_4_;
          auVar62._8_4_ = auVar110._8_4_ * auVar109._8_4_;
          auVar62._12_4_ = auVar110._12_4_ * auVar109._12_4_;
          auVar62._16_4_ = auVar110._16_4_ * auVar109._16_4_;
          auVar62._20_4_ = auVar110._20_4_ * auVar109._20_4_;
          auVar62._24_4_ = auVar110._24_4_ * auVar109._24_4_;
          auVar62._28_4_ = auVar109._28_4_;
          auVar109 = vmulps_avx512vl(auVar110,auVar103);
          auVar8 = vfmadd213ps_fma(auVar58,auVar112,ZEXT1632(auVar88));
          auVar9 = vfmadd213ps_fma(auVar59,auVar112,ZEXT1632(auVar87));
          auVar106 = vfmadd213ps_avx512vl(auVar105,auVar112,auVar107);
          auVar108 = vfmadd213ps_avx512vl(auVar61,auVar113,ZEXT1632(auVar92));
          auVar11 = vfnmadd213ps_fma(auVar58,auVar112,ZEXT1632(auVar88));
          auVar88 = vfmadd213ps_fma(auVar62,auVar113,ZEXT1632(auVar7));
          auVar12 = vfnmadd213ps_fma(auVar59,auVar112,ZEXT1632(auVar87));
          auVar87 = vfmadd213ps_fma(auVar109,auVar113,auVar102);
          auVar160 = vfnmadd231ps_fma(auVar107,auVar112,auVar105);
          auVar149 = vfnmadd213ps_fma(auVar61,auVar113,ZEXT1632(auVar92));
          auVar159 = vfnmadd213ps_fma(auVar62,auVar113,ZEXT1632(auVar7));
          auVar161 = vfnmadd231ps_fma(auVar102,auVar113,auVar109);
          auVar102 = vsubps_avx512vl(auVar108,ZEXT1632(auVar11));
          auVar109 = vsubps_avx(ZEXT1632(auVar88),ZEXT1632(auVar12));
          auVar110 = vsubps_avx(ZEXT1632(auVar87),ZEXT1632(auVar160));
          auVar63._4_4_ = auVar109._4_4_ * auVar160._4_4_;
          auVar63._0_4_ = auVar109._0_4_ * auVar160._0_4_;
          auVar63._8_4_ = auVar109._8_4_ * auVar160._8_4_;
          auVar63._12_4_ = auVar109._12_4_ * auVar160._12_4_;
          auVar63._16_4_ = auVar109._16_4_ * 0.0;
          auVar63._20_4_ = auVar109._20_4_ * 0.0;
          auVar63._24_4_ = auVar109._24_4_ * 0.0;
          auVar63._28_4_ = auVar105._28_4_;
          auVar92 = vfmsub231ps_fma(auVar63,ZEXT1632(auVar12),auVar110);
          auVar64._4_4_ = auVar110._4_4_ * auVar11._4_4_;
          auVar64._0_4_ = auVar110._0_4_ * auVar11._0_4_;
          auVar64._8_4_ = auVar110._8_4_ * auVar11._8_4_;
          auVar64._12_4_ = auVar110._12_4_ * auVar11._12_4_;
          auVar64._16_4_ = auVar110._16_4_ * 0.0;
          auVar64._20_4_ = auVar110._20_4_ * 0.0;
          auVar64._24_4_ = auVar110._24_4_ * 0.0;
          auVar64._28_4_ = auVar110._28_4_;
          auVar7 = vfmsub231ps_fma(auVar64,ZEXT1632(auVar160),auVar102);
          auVar65._4_4_ = auVar12._4_4_ * auVar102._4_4_;
          auVar65._0_4_ = auVar12._0_4_ * auVar102._0_4_;
          auVar65._8_4_ = auVar12._8_4_ * auVar102._8_4_;
          auVar65._12_4_ = auVar12._12_4_ * auVar102._12_4_;
          auVar65._16_4_ = auVar102._16_4_ * 0.0;
          auVar65._20_4_ = auVar102._20_4_ * 0.0;
          auVar65._24_4_ = auVar102._24_4_ * 0.0;
          auVar65._28_4_ = auVar102._28_4_;
          auVar10 = vfmsub231ps_fma(auVar65,ZEXT1632(auVar11),auVar109);
          auVar109 = vfmadd231ps_avx512vl(ZEXT1632(auVar10),auVar103,ZEXT1632(auVar7));
          auVar109 = vfmadd231ps_avx512vl(auVar109,auVar103,ZEXT1632(auVar92));
          auVar95 = ZEXT1632(auVar89);
          uVar80 = vcmpps_avx512vl(auVar109,auVar95,2);
          bVar73 = (byte)uVar80;
          fVar140 = (float)((uint)(bVar73 & 1) * auVar8._0_4_ |
                           (uint)!(bool)(bVar73 & 1) * auVar149._0_4_);
          bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
          fVar142 = (float)((uint)bVar16 * auVar8._4_4_ | (uint)!bVar16 * auVar149._4_4_);
          bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
          fVar145 = (float)((uint)bVar16 * auVar8._8_4_ | (uint)!bVar16 * auVar149._8_4_);
          bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
          fVar146 = (float)((uint)bVar16 * auVar8._12_4_ | (uint)!bVar16 * auVar149._12_4_);
          auVar103 = ZEXT1632(CONCAT412(fVar146,CONCAT48(fVar145,CONCAT44(fVar142,fVar140))));
          fVar141 = (float)((uint)(bVar73 & 1) * auVar9._0_4_ |
                           (uint)!(bool)(bVar73 & 1) * auVar159._0_4_);
          bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
          fVar144 = (float)((uint)bVar16 * auVar9._4_4_ | (uint)!bVar16 * auVar159._4_4_);
          bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
          fVar143 = (float)((uint)bVar16 * auVar9._8_4_ | (uint)!bVar16 * auVar159._8_4_);
          bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
          fVar147 = (float)((uint)bVar16 * auVar9._12_4_ | (uint)!bVar16 * auVar159._12_4_);
          auVar104 = ZEXT1632(CONCAT412(fVar147,CONCAT48(fVar143,CONCAT44(fVar144,fVar141))));
          auVar130._0_4_ =
               (float)((uint)(bVar73 & 1) * auVar106._0_4_ |
                      (uint)!(bool)(bVar73 & 1) * auVar161._0_4_);
          bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
          auVar130._4_4_ = (float)((uint)bVar16 * auVar106._4_4_ | (uint)!bVar16 * auVar161._4_4_);
          bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
          auVar130._8_4_ = (float)((uint)bVar16 * auVar106._8_4_ | (uint)!bVar16 * auVar161._8_4_);
          bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
          auVar130._12_4_ =
               (float)((uint)bVar16 * auVar106._12_4_ | (uint)!bVar16 * auVar161._12_4_);
          fVar163 = (float)((uint)((byte)(uVar80 >> 4) & 1) * auVar106._16_4_);
          auVar130._16_4_ = fVar163;
          fVar195 = (float)((uint)((byte)(uVar80 >> 5) & 1) * auVar106._20_4_);
          auVar130._20_4_ = fVar195;
          fVar208 = (float)((uint)((byte)(uVar80 >> 6) & 1) * auVar106._24_4_);
          auVar130._24_4_ = fVar208;
          iVar1 = (uint)(byte)(uVar80 >> 7) * auVar106._28_4_;
          auVar130._28_4_ = iVar1;
          auVar109 = vblendmps_avx512vl(ZEXT1632(auVar11),auVar108);
          auVar131._0_4_ =
               (uint)(bVar73 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar92._0_4_;
          bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
          auVar131._4_4_ = (uint)bVar16 * auVar109._4_4_ | (uint)!bVar16 * auVar92._4_4_;
          bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
          auVar131._8_4_ = (uint)bVar16 * auVar109._8_4_ | (uint)!bVar16 * auVar92._8_4_;
          bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
          auVar131._12_4_ = (uint)bVar16 * auVar109._12_4_ | (uint)!bVar16 * auVar92._12_4_;
          auVar131._16_4_ = (uint)((byte)(uVar80 >> 4) & 1) * auVar109._16_4_;
          auVar131._20_4_ = (uint)((byte)(uVar80 >> 5) & 1) * auVar109._20_4_;
          auVar131._24_4_ = (uint)((byte)(uVar80 >> 6) & 1) * auVar109._24_4_;
          auVar131._28_4_ = (uint)(byte)(uVar80 >> 7) * auVar109._28_4_;
          auVar109 = vblendmps_avx512vl(ZEXT1632(auVar12),ZEXT1632(auVar88));
          auVar132._0_4_ =
               (float)((uint)(bVar73 & 1) * auVar109._0_4_ |
                      (uint)!(bool)(bVar73 & 1) * auVar8._0_4_);
          bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
          auVar132._4_4_ = (float)((uint)bVar16 * auVar109._4_4_ | (uint)!bVar16 * auVar8._4_4_);
          bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
          auVar132._8_4_ = (float)((uint)bVar16 * auVar109._8_4_ | (uint)!bVar16 * auVar8._8_4_);
          bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
          auVar132._12_4_ = (float)((uint)bVar16 * auVar109._12_4_ | (uint)!bVar16 * auVar8._12_4_);
          fVar174 = (float)((uint)((byte)(uVar80 >> 4) & 1) * auVar109._16_4_);
          auVar132._16_4_ = fVar174;
          fVar196 = (float)((uint)((byte)(uVar80 >> 5) & 1) * auVar109._20_4_);
          auVar132._20_4_ = fVar196;
          fVar209 = (float)((uint)((byte)(uVar80 >> 6) & 1) * auVar109._24_4_);
          auVar132._24_4_ = fVar209;
          auVar132._28_4_ = (uint)(byte)(uVar80 >> 7) * auVar109._28_4_;
          auVar109 = vblendmps_avx512vl(ZEXT1632(auVar160),ZEXT1632(auVar87));
          auVar133._0_4_ =
               (float)((uint)(bVar73 & 1) * auVar109._0_4_ |
                      (uint)!(bool)(bVar73 & 1) * auVar9._0_4_);
          bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
          auVar133._4_4_ = (float)((uint)bVar16 * auVar109._4_4_ | (uint)!bVar16 * auVar9._4_4_);
          bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
          auVar133._8_4_ = (float)((uint)bVar16 * auVar109._8_4_ | (uint)!bVar16 * auVar9._8_4_);
          bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
          auVar133._12_4_ = (float)((uint)bVar16 * auVar109._12_4_ | (uint)!bVar16 * auVar9._12_4_);
          fVar86 = (float)((uint)((byte)(uVar80 >> 4) & 1) * auVar109._16_4_);
          auVar133._16_4_ = fVar86;
          fVar85 = (float)((uint)((byte)(uVar80 >> 5) & 1) * auVar109._20_4_);
          auVar133._20_4_ = fVar85;
          fVar139 = (float)((uint)((byte)(uVar80 >> 6) & 1) * auVar109._24_4_);
          auVar133._24_4_ = fVar139;
          iVar2 = (uint)(byte)(uVar80 >> 7) * auVar109._28_4_;
          auVar133._28_4_ = iVar2;
          auVar134._0_4_ =
               (uint)(bVar73 & 1) * (int)auVar11._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar108._0_4_;
          bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
          auVar134._4_4_ = (uint)bVar16 * (int)auVar11._4_4_ | (uint)!bVar16 * auVar108._4_4_;
          bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
          auVar134._8_4_ = (uint)bVar16 * (int)auVar11._8_4_ | (uint)!bVar16 * auVar108._8_4_;
          bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
          auVar134._12_4_ = (uint)bVar16 * (int)auVar11._12_4_ | (uint)!bVar16 * auVar108._12_4_;
          auVar134._16_4_ = (uint)!(bool)((byte)(uVar80 >> 4) & 1) * auVar108._16_4_;
          auVar134._20_4_ = (uint)!(bool)((byte)(uVar80 >> 5) & 1) * auVar108._20_4_;
          auVar134._24_4_ = (uint)!(bool)((byte)(uVar80 >> 6) & 1) * auVar108._24_4_;
          auVar134._28_4_ = (uint)!SUB81(uVar80 >> 7,0) * auVar108._28_4_;
          bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
          bVar18 = (bool)((byte)(uVar80 >> 2) & 1);
          bVar20 = (bool)((byte)(uVar80 >> 3) & 1);
          bVar17 = (bool)((byte)(uVar80 >> 1) & 1);
          bVar19 = (bool)((byte)(uVar80 >> 2) & 1);
          bVar21 = (bool)((byte)(uVar80 >> 3) & 1);
          auVar108 = vsubps_avx512vl(auVar134,auVar103);
          auVar110 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar12._12_4_ |
                                                   (uint)!bVar20 * auVar88._12_4_,
                                                   CONCAT48((uint)bVar18 * (int)auVar12._8_4_ |
                                                            (uint)!bVar18 * auVar88._8_4_,
                                                            CONCAT44((uint)bVar16 *
                                                                     (int)auVar12._4_4_ |
                                                                     (uint)!bVar16 * auVar88._4_4_,
                                                                     (uint)(bVar73 & 1) *
                                                                     (int)auVar12._0_4_ |
                                                                     (uint)!(bool)(bVar73 & 1) *
                                                                     auVar88._0_4_)))),auVar104);
          auVar192 = ZEXT3264(auVar110);
          auVar106 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar160._12_4_ |
                                                   (uint)!bVar21 * auVar87._12_4_,
                                                   CONCAT48((uint)bVar19 * (int)auVar160._8_4_ |
                                                            (uint)!bVar19 * auVar87._8_4_,
                                                            CONCAT44((uint)bVar17 *
                                                                     (int)auVar160._4_4_ |
                                                                     (uint)!bVar17 * auVar87._4_4_,
                                                                     (uint)(bVar73 & 1) *
                                                                     (int)auVar160._0_4_ |
                                                                     (uint)!(bool)(bVar73 & 1) *
                                                                     auVar87._0_4_)))),auVar130);
          auVar105 = vsubps_avx(auVar103,auVar131);
          auVar193 = ZEXT3264(auVar105);
          auVar102 = vsubps_avx(auVar104,auVar132);
          auVar107 = vsubps_avx(auVar130,auVar133);
          auVar66._4_4_ = auVar106._4_4_ * fVar142;
          auVar66._0_4_ = auVar106._0_4_ * fVar140;
          auVar66._8_4_ = auVar106._8_4_ * fVar145;
          auVar66._12_4_ = auVar106._12_4_ * fVar146;
          auVar66._16_4_ = auVar106._16_4_ * 0.0;
          auVar66._20_4_ = auVar106._20_4_ * 0.0;
          auVar66._24_4_ = auVar106._24_4_ * 0.0;
          auVar66._28_4_ = 0;
          auVar88 = vfmsub231ps_fma(auVar66,auVar130,auVar108);
          auVar177._0_4_ = fVar141 * auVar108._0_4_;
          auVar177._4_4_ = fVar144 * auVar108._4_4_;
          auVar177._8_4_ = fVar143 * auVar108._8_4_;
          auVar177._12_4_ = fVar147 * auVar108._12_4_;
          auVar177._16_4_ = auVar108._16_4_ * 0.0;
          auVar177._20_4_ = auVar108._20_4_ * 0.0;
          auVar177._24_4_ = auVar108._24_4_ * 0.0;
          auVar177._28_4_ = 0;
          auVar87 = vfmsub231ps_fma(auVar177,auVar103,auVar110);
          auVar109 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),auVar95,ZEXT1632(auVar88));
          auVar189._0_4_ = auVar110._0_4_ * auVar130._0_4_;
          auVar189._4_4_ = auVar110._4_4_ * auVar130._4_4_;
          auVar189._8_4_ = auVar110._8_4_ * auVar130._8_4_;
          auVar189._12_4_ = auVar110._12_4_ * auVar130._12_4_;
          auVar189._16_4_ = auVar110._16_4_ * fVar163;
          auVar189._20_4_ = auVar110._20_4_ * fVar195;
          auVar189._24_4_ = auVar110._24_4_ * fVar208;
          auVar189._28_4_ = 0;
          auVar88 = vfmsub231ps_fma(auVar189,auVar104,auVar106);
          auVar111 = vfmadd231ps_avx512vl(auVar109,auVar95,ZEXT1632(auVar88));
          auVar109 = vmulps_avx512vl(auVar107,auVar131);
          auVar109 = vfmsub231ps_avx512vl(auVar109,auVar105,auVar133);
          auVar67._4_4_ = auVar102._4_4_ * auVar133._4_4_;
          auVar67._0_4_ = auVar102._0_4_ * auVar133._0_4_;
          auVar67._8_4_ = auVar102._8_4_ * auVar133._8_4_;
          auVar67._12_4_ = auVar102._12_4_ * auVar133._12_4_;
          auVar67._16_4_ = auVar102._16_4_ * fVar86;
          auVar67._20_4_ = auVar102._20_4_ * fVar85;
          auVar67._24_4_ = auVar102._24_4_ * fVar139;
          auVar67._28_4_ = iVar2;
          auVar88 = vfmsub231ps_fma(auVar67,auVar132,auVar107);
          auVar190._0_4_ = auVar132._0_4_ * auVar105._0_4_;
          auVar190._4_4_ = auVar132._4_4_ * auVar105._4_4_;
          auVar190._8_4_ = auVar132._8_4_ * auVar105._8_4_;
          auVar190._12_4_ = auVar132._12_4_ * auVar105._12_4_;
          auVar190._16_4_ = fVar174 * auVar105._16_4_;
          auVar190._20_4_ = fVar196 * auVar105._20_4_;
          auVar190._24_4_ = fVar209 * auVar105._24_4_;
          auVar190._28_4_ = 0;
          auVar87 = vfmsub231ps_fma(auVar190,auVar102,auVar131);
          auVar109 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),auVar95,auVar109);
          auVar94 = vfmadd231ps_avx512vl(auVar109,auVar95,ZEXT1632(auVar88));
          auVar191 = ZEXT3264(auVar94);
          auVar109 = vmaxps_avx(auVar111,auVar94);
          uVar158 = vcmpps_avx512vl(auVar109,auVar95,2);
          bVar82 = bVar82 & (byte)uVar158;
          if (bVar82 != 0) {
            auVar68._4_4_ = auVar107._4_4_ * auVar110._4_4_;
            auVar68._0_4_ = auVar107._0_4_ * auVar110._0_4_;
            auVar68._8_4_ = auVar107._8_4_ * auVar110._8_4_;
            auVar68._12_4_ = auVar107._12_4_ * auVar110._12_4_;
            auVar68._16_4_ = auVar107._16_4_ * auVar110._16_4_;
            auVar68._20_4_ = auVar107._20_4_ * auVar110._20_4_;
            auVar68._24_4_ = auVar107._24_4_ * auVar110._24_4_;
            auVar68._28_4_ = auVar109._28_4_;
            auVar7 = vfmsub231ps_fma(auVar68,auVar102,auVar106);
            auVar69._4_4_ = auVar106._4_4_ * auVar105._4_4_;
            auVar69._0_4_ = auVar106._0_4_ * auVar105._0_4_;
            auVar69._8_4_ = auVar106._8_4_ * auVar105._8_4_;
            auVar69._12_4_ = auVar106._12_4_ * auVar105._12_4_;
            auVar69._16_4_ = auVar106._16_4_ * auVar105._16_4_;
            auVar69._20_4_ = auVar106._20_4_ * auVar105._20_4_;
            auVar69._24_4_ = auVar106._24_4_ * auVar105._24_4_;
            auVar69._28_4_ = auVar106._28_4_;
            auVar92 = vfmsub231ps_fma(auVar69,auVar108,auVar107);
            auVar70._4_4_ = auVar102._4_4_ * auVar108._4_4_;
            auVar70._0_4_ = auVar102._0_4_ * auVar108._0_4_;
            auVar70._8_4_ = auVar102._8_4_ * auVar108._8_4_;
            auVar70._12_4_ = auVar102._12_4_ * auVar108._12_4_;
            auVar70._16_4_ = auVar102._16_4_ * auVar108._16_4_;
            auVar70._20_4_ = auVar102._20_4_ * auVar108._20_4_;
            auVar70._24_4_ = auVar102._24_4_ * auVar108._24_4_;
            auVar70._28_4_ = auVar102._28_4_;
            auVar8 = vfmsub231ps_fma(auVar70,auVar105,auVar110);
            auVar88 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar92),ZEXT1632(auVar8));
            auVar87 = vfmadd231ps_fma(ZEXT1632(auVar88),ZEXT1632(auVar7),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar109 = vrcp14ps_avx512vl(ZEXT1632(auVar87));
            auVar34._8_4_ = 0x3f800000;
            auVar34._0_8_ = 0x3f8000003f800000;
            auVar34._12_4_ = 0x3f800000;
            auVar34._16_4_ = 0x3f800000;
            auVar34._20_4_ = 0x3f800000;
            auVar34._24_4_ = 0x3f800000;
            auVar34._28_4_ = 0x3f800000;
            auVar110 = vfnmadd213ps_avx512vl(auVar109,ZEXT1632(auVar87),auVar34);
            auVar88 = vfmadd132ps_fma(auVar110,auVar109,auVar109);
            auVar192 = ZEXT1664(auVar88);
            auVar71._4_4_ = auVar8._4_4_ * auVar130._4_4_;
            auVar71._0_4_ = auVar8._0_4_ * auVar130._0_4_;
            auVar71._8_4_ = auVar8._8_4_ * auVar130._8_4_;
            auVar71._12_4_ = auVar8._12_4_ * auVar130._12_4_;
            auVar71._16_4_ = fVar163 * 0.0;
            auVar71._20_4_ = fVar195 * 0.0;
            auVar71._24_4_ = fVar208 * 0.0;
            auVar71._28_4_ = iVar1;
            auVar92 = vfmadd231ps_fma(auVar71,auVar104,ZEXT1632(auVar92));
            auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar103,ZEXT1632(auVar7));
            fVar195 = auVar88._0_4_;
            fVar208 = auVar88._4_4_;
            fVar209 = auVar88._8_4_;
            fVar196 = auVar88._12_4_;
            local_260._28_4_ = auVar109._28_4_;
            local_260._0_28_ =
                 ZEXT1628(CONCAT412(auVar92._12_4_ * fVar196,
                                    CONCAT48(auVar92._8_4_ * fVar209,
                                             CONCAT44(auVar92._4_4_ * fVar208,
                                                      auVar92._0_4_ * fVar195))));
            auVar193 = ZEXT3264(local_260);
            uVar158 = vcmpps_avx512vl(local_260,local_3c0,0xd);
            fVar163 = (ray->super_RayK<1>).tfar;
            auVar35._4_4_ = fVar163;
            auVar35._0_4_ = fVar163;
            auVar35._8_4_ = fVar163;
            auVar35._12_4_ = fVar163;
            auVar35._16_4_ = fVar163;
            auVar35._20_4_ = fVar163;
            auVar35._24_4_ = fVar163;
            auVar35._28_4_ = fVar163;
            uVar23 = vcmpps_avx512vl(local_260,auVar35,2);
            bVar82 = (byte)uVar158 & (byte)uVar23 & bVar82;
            if (bVar82 != 0) {
              uVar84 = vcmpps_avx512vl(ZEXT1632(auVar87),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar84 = bVar82 & uVar84;
              if ((char)uVar84 != '\0') {
                fVar163 = auVar111._0_4_ * fVar195;
                fVar174 = auVar111._4_4_ * fVar208;
                auVar72._4_4_ = fVar174;
                auVar72._0_4_ = fVar163;
                fVar85 = auVar111._8_4_ * fVar209;
                auVar72._8_4_ = fVar85;
                fVar86 = auVar111._12_4_ * fVar196;
                auVar72._12_4_ = fVar86;
                fVar139 = auVar111._16_4_ * 0.0;
                auVar72._16_4_ = fVar139;
                fVar140 = auVar111._20_4_ * 0.0;
                auVar72._20_4_ = fVar140;
                fVar141 = auVar111._24_4_ * 0.0;
                auVar72._24_4_ = fVar141;
                auVar72._28_4_ = auVar111._28_4_;
                auVar173._8_4_ = 0x3f800000;
                auVar173._0_8_ = 0x3f8000003f800000;
                auVar173._12_4_ = 0x3f800000;
                auVar173._16_4_ = 0x3f800000;
                auVar173._20_4_ = 0x3f800000;
                auVar173._24_4_ = 0x3f800000;
                auVar173._28_4_ = 0x3f800000;
                auVar109 = vsubps_avx(auVar173,auVar72);
                local_2a0._0_4_ =
                     (float)((uint)(bVar73 & 1) * (int)fVar163 |
                            (uint)!(bool)(bVar73 & 1) * auVar109._0_4_);
                bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
                local_2a0._4_4_ =
                     (float)((uint)bVar16 * (int)fVar174 | (uint)!bVar16 * auVar109._4_4_);
                bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
                local_2a0._8_4_ =
                     (float)((uint)bVar16 * (int)fVar85 | (uint)!bVar16 * auVar109._8_4_);
                bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
                local_2a0._12_4_ =
                     (float)((uint)bVar16 * (int)fVar86 | (uint)!bVar16 * auVar109._12_4_);
                bVar16 = (bool)((byte)(uVar80 >> 4) & 1);
                local_2a0._16_4_ =
                     (float)((uint)bVar16 * (int)fVar139 | (uint)!bVar16 * auVar109._16_4_);
                bVar16 = (bool)((byte)(uVar80 >> 5) & 1);
                local_2a0._20_4_ =
                     (float)((uint)bVar16 * (int)fVar140 | (uint)!bVar16 * auVar109._20_4_);
                bVar16 = (bool)((byte)(uVar80 >> 6) & 1);
                local_2a0._24_4_ =
                     (float)((uint)bVar16 * (int)fVar141 | (uint)!bVar16 * auVar109._24_4_);
                bVar16 = SUB81(uVar80 >> 7,0);
                local_2a0._28_4_ =
                     (float)((uint)bVar16 * auVar111._28_4_ | (uint)!bVar16 * auVar109._28_4_);
                auVar109 = vsubps_avx(auVar113,auVar112);
                auVar88 = vfmadd213ps_fma(auVar109,local_2a0,auVar112);
                fVar163 = local_518->depth_scale;
                auVar36._4_4_ = fVar163;
                auVar36._0_4_ = fVar163;
                auVar36._8_4_ = fVar163;
                auVar36._12_4_ = fVar163;
                auVar36._16_4_ = fVar163;
                auVar36._20_4_ = fVar163;
                auVar36._24_4_ = fVar163;
                auVar36._28_4_ = fVar163;
                auVar109 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar88._12_4_ + auVar88._12_4_,
                                                              CONCAT48(auVar88._8_4_ + auVar88._8_4_
                                                                       ,CONCAT44(auVar88._4_4_ +
                                                                                 auVar88._4_4_,
                                                                                 auVar88._0_4_ +
                                                                                 auVar88._0_4_)))),
                                           auVar36);
                uVar22 = vcmpps_avx512vl(local_260,auVar109,6);
                uVar84 = uVar84 & uVar22;
                uVar83 = (uint)uVar84;
                bVar82 = (byte)uVar84;
                if (bVar82 != 0) {
                  auVar162._0_4_ = auVar94._0_4_ * fVar195;
                  auVar162._4_4_ = auVar94._4_4_ * fVar208;
                  auVar162._8_4_ = auVar94._8_4_ * fVar209;
                  auVar162._12_4_ = auVar94._12_4_ * fVar196;
                  auVar162._16_4_ = auVar94._16_4_ * 0.0;
                  auVar162._20_4_ = auVar94._20_4_ * 0.0;
                  auVar162._24_4_ = auVar94._24_4_ * 0.0;
                  auVar162._28_4_ = 0;
                  auVar178._8_4_ = 0x3f800000;
                  auVar178._0_8_ = 0x3f8000003f800000;
                  auVar178._12_4_ = 0x3f800000;
                  auVar178._16_4_ = 0x3f800000;
                  auVar178._20_4_ = 0x3f800000;
                  auVar178._24_4_ = 0x3f800000;
                  auVar178._28_4_ = 0x3f800000;
                  auVar109 = vsubps_avx(auVar178,auVar162);
                  auVar135._0_4_ =
                       (uint)(bVar73 & 1) * (int)auVar162._0_4_ |
                       (uint)!(bool)(bVar73 & 1) * auVar109._0_4_;
                  bVar16 = (bool)((byte)(uVar80 >> 1) & 1);
                  auVar135._4_4_ =
                       (uint)bVar16 * (int)auVar162._4_4_ | (uint)!bVar16 * auVar109._4_4_;
                  bVar16 = (bool)((byte)(uVar80 >> 2) & 1);
                  auVar135._8_4_ =
                       (uint)bVar16 * (int)auVar162._8_4_ | (uint)!bVar16 * auVar109._8_4_;
                  bVar16 = (bool)((byte)(uVar80 >> 3) & 1);
                  auVar135._12_4_ =
                       (uint)bVar16 * (int)auVar162._12_4_ | (uint)!bVar16 * auVar109._12_4_;
                  bVar16 = (bool)((byte)(uVar80 >> 4) & 1);
                  auVar135._16_4_ =
                       (uint)bVar16 * (int)auVar162._16_4_ | (uint)!bVar16 * auVar109._16_4_;
                  bVar16 = (bool)((byte)(uVar80 >> 5) & 1);
                  auVar135._20_4_ =
                       (uint)bVar16 * (int)auVar162._20_4_ | (uint)!bVar16 * auVar109._20_4_;
                  bVar16 = (bool)((byte)(uVar80 >> 6) & 1);
                  auVar135._24_4_ =
                       (uint)bVar16 * (int)auVar162._24_4_ | (uint)!bVar16 * auVar109._24_4_;
                  auVar135._28_4_ = (uint)!SUB81(uVar80 >> 7,0) * auVar109._28_4_;
                  auVar37._8_4_ = 0x40000000;
                  auVar37._0_8_ = 0x4000000040000000;
                  auVar37._12_4_ = 0x40000000;
                  auVar37._16_4_ = 0x40000000;
                  auVar37._20_4_ = 0x40000000;
                  auVar37._24_4_ = 0x40000000;
                  auVar37._28_4_ = 0x40000000;
                  local_280 = vfmsub132ps_avx512vl(auVar135,auVar178,auVar37);
                  local_240 = (int)lVar76;
                  local_23c = iVar13;
                  local_230 = local_4b0._0_8_;
                  uStack_228 = local_4b0._8_8_;
                  local_220 = local_4c0._0_8_;
                  uStack_218 = local_4c0._8_8_;
                  local_210 = local_4d0._0_8_;
                  uStack_208 = local_4d0._8_8_;
                  local_200 = local_4e0;
                  uStack_1f8 = uStack_4d8;
                  pGVar79 = (context->scene->geometries).items[local_538].ptr;
                  if ((pGVar79->mask & (ray->super_RayK<1>).mask) != 0) {
                    auVar88 = vcvtsi2ss_avx512f(auVar89,(int)lVar76);
                    fVar163 = auVar88._0_4_;
                    local_1e0[0] = (fVar163 + local_2a0._0_4_ + 0.0) * local_120;
                    local_1e0[1] = (fVar163 + local_2a0._4_4_ + 1.0) * fStack_11c;
                    local_1e0[2] = (fVar163 + local_2a0._8_4_ + 2.0) * fStack_118;
                    local_1e0[3] = (fVar163 + local_2a0._12_4_ + 3.0) * fStack_114;
                    fStack_1d0 = (fVar163 + local_2a0._16_4_ + 4.0) * fStack_110;
                    fStack_1cc = (fVar163 + local_2a0._20_4_ + 5.0) * fStack_10c;
                    fStack_1c8 = (fVar163 + local_2a0._24_4_ + 6.0) * fStack_108;
                    fStack_1c4 = fVar163 + local_2a0._28_4_ + 7.0;
                    local_1c0 = local_280;
                    local_1a0 = local_260;
                    auVar155._8_4_ = 0x7f800000;
                    auVar155._0_8_ = 0x7f8000007f800000;
                    auVar155._12_4_ = 0x7f800000;
                    auVar155._16_4_ = 0x7f800000;
                    auVar155._20_4_ = 0x7f800000;
                    auVar155._24_4_ = 0x7f800000;
                    auVar155._28_4_ = 0x7f800000;
                    auVar109 = vblendmps_avx512vl(auVar155,local_260);
                    auVar136._0_4_ =
                         (uint)(bVar82 & 1) * auVar109._0_4_ |
                         (uint)!(bool)(bVar82 & 1) * 0x7f800000;
                    bVar16 = (bool)((byte)(uVar84 >> 1) & 1);
                    auVar136._4_4_ = (uint)bVar16 * auVar109._4_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)((byte)(uVar84 >> 2) & 1);
                    auVar136._8_4_ = (uint)bVar16 * auVar109._8_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)((byte)(uVar84 >> 3) & 1);
                    auVar136._12_4_ = (uint)bVar16 * auVar109._12_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)((byte)(uVar84 >> 4) & 1);
                    auVar136._16_4_ = (uint)bVar16 * auVar109._16_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)((byte)(uVar84 >> 5) & 1);
                    auVar136._20_4_ = (uint)bVar16 * auVar109._20_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)((byte)(uVar84 >> 6) & 1);
                    auVar136._24_4_ = (uint)bVar16 * auVar109._24_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = SUB81(uVar84 >> 7,0);
                    auVar136._28_4_ = (uint)bVar16 * auVar109._28_4_ | (uint)!bVar16 * 0x7f800000;
                    auVar109 = vshufps_avx(auVar136,auVar136,0xb1);
                    auVar109 = vminps_avx(auVar136,auVar109);
                    auVar110 = vshufpd_avx(auVar109,auVar109,5);
                    auVar109 = vminps_avx(auVar109,auVar110);
                    auVar110 = vpermpd_avx2(auVar109,0x4e);
                    auVar109 = vminps_avx(auVar109,auVar110);
                    uVar158 = vcmpps_avx512vl(auVar136,auVar109,0);
                    if ((bVar82 & (byte)uVar158) != 0) {
                      uVar83 = (uint)(bVar82 & (byte)uVar158);
                    }
                    uVar75 = 0;
                    for (; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x80000000) {
                      uVar75 = uVar75 + 1;
                    }
                    uVar80 = (ulong)uVar75;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar79->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_420 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                      local_440 = local_260;
                      local_468 = pGVar79;
                      do {
                        local_494 = local_1e0[uVar80];
                        local_490 = *(undefined4 *)(local_1c0 + uVar80 * 4);
                        (ray->super_RayK<1>).tfar = *(float *)(local_1a0 + uVar80 * 4);
                        local_510.context = context->user;
                        fVar163 = 1.0 - local_494;
                        auVar27._8_4_ = 0x80000000;
                        auVar27._0_8_ = 0x8000000080000000;
                        auVar27._12_4_ = 0x80000000;
                        auVar92 = vxorps_avx512vl(ZEXT416((uint)fVar163),auVar27);
                        auVar88 = ZEXT416((uint)(local_494 * fVar163 * 4.0));
                        auVar87 = vfnmsub213ss_fma(ZEXT416((uint)local_494),ZEXT416((uint)local_494)
                                                   ,auVar88);
                        auVar88 = vfmadd213ss_fma(ZEXT416((uint)fVar163),ZEXT416((uint)fVar163),
                                                  auVar88);
                        fVar163 = fVar163 * auVar92._0_4_ * 0.5;
                        fVar195 = auVar87._0_4_ * 0.5;
                        auVar192 = ZEXT464((uint)fVar195);
                        fVar208 = auVar88._0_4_ * 0.5;
                        fVar209 = local_494 * local_494 * 0.5;
                        auVar183._0_4_ = fVar209 * (float)local_4e0._0_4_;
                        auVar183._4_4_ = fVar209 * (float)local_4e0._4_4_;
                        auVar183._8_4_ = fVar209 * (float)uStack_4d8;
                        auVar183._12_4_ = fVar209 * uStack_4d8._4_4_;
                        auVar168._4_4_ = fVar208;
                        auVar168._0_4_ = fVar208;
                        auVar168._8_4_ = fVar208;
                        auVar168._12_4_ = fVar208;
                        auVar88 = vfmadd132ps_fma(auVar168,auVar183,local_4d0);
                        auVar184._4_4_ = fVar195;
                        auVar184._0_4_ = fVar195;
                        auVar184._8_4_ = fVar195;
                        auVar184._12_4_ = fVar195;
                        auVar88 = vfmadd132ps_fma(auVar184,auVar88,local_4c0);
                        auVar191 = ZEXT1664(auVar88);
                        auVar169._4_4_ = fVar163;
                        auVar169._0_4_ = fVar163;
                        auVar169._8_4_ = fVar163;
                        auVar169._12_4_ = fVar163;
                        auVar87 = vfmadd132ps_fma(auVar169,auVar88,local_4b0);
                        local_4a0 = vmovlps_avx(auVar87);
                        local_498 = vextractps_avx(auVar87,2);
                        local_48c = (int)local_528;
                        local_488 = (int)local_538;
                        local_484 = (local_510.context)->instID[0];
                        local_480 = (local_510.context)->instPrimID[0];
                        local_54c = -1;
                        local_510.valid = &local_54c;
                        local_510.geometryUserPtr = pGVar79->userPtr;
                        local_510.ray = (RTCRayN *)ray;
                        local_510.hit = (RTCHitN *)&local_4a0;
                        local_510.N = 1;
                        if (pGVar79->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01b38f98:
                          p_Var15 = context->args->filter;
                          if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar79->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar191 = ZEXT1664(auVar191._0_16_);
                            auVar192 = ZEXT1664(auVar192._0_16_);
                            (*p_Var15)(&local_510);
                            auVar193 = ZEXT3264(local_440);
                            ray = local_540;
                            pGVar79 = local_468;
                            if (*local_510.valid == 0) goto LAB_01b39036;
                          }
                          (((Vec3f *)((long)local_510.ray + 0x30))->field_0).components[0] =
                               *(float *)local_510.hit;
                          (((Vec3f *)((long)local_510.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_510.hit + 4);
                          (((Vec3f *)((long)local_510.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_510.hit + 8);
                          *(float *)((long)local_510.ray + 0x3c) = *(float *)(local_510.hit + 0xc);
                          *(float *)((long)local_510.ray + 0x40) = *(float *)(local_510.hit + 0x10);
                          *(float *)((long)local_510.ray + 0x44) = *(float *)(local_510.hit + 0x14);
                          *(float *)((long)local_510.ray + 0x48) = *(float *)(local_510.hit + 0x18);
                          *(float *)((long)local_510.ray + 0x4c) = *(float *)(local_510.hit + 0x1c);
                          *(float *)((long)local_510.ray + 0x50) = *(float *)(local_510.hit + 0x20);
                        }
                        else {
                          auVar191 = ZEXT1664(auVar88);
                          auVar192 = ZEXT464((uint)fVar195);
                          (*pGVar79->intersectionFilterN)(&local_510);
                          auVar193 = ZEXT3264(local_440);
                          ray = local_540;
                          pGVar79 = local_468;
                          if (*local_510.valid != 0) goto LAB_01b38f98;
LAB_01b39036:
                          (local_540->super_RayK<1>).tfar = (float)local_420._0_4_;
                          ray = local_540;
                          pGVar79 = local_468;
                        }
                        bVar82 = ~(byte)(1 << ((uint)uVar80 & 0x1f)) & (byte)uVar84;
                        fVar163 = (ray->super_RayK<1>).tfar;
                        auVar38._4_4_ = fVar163;
                        auVar38._0_4_ = fVar163;
                        auVar38._8_4_ = fVar163;
                        auVar38._12_4_ = fVar163;
                        auVar38._16_4_ = fVar163;
                        auVar38._20_4_ = fVar163;
                        auVar38._24_4_ = fVar163;
                        auVar38._28_4_ = fVar163;
                        uVar158 = vcmpps_avx512vl(auVar193._0_32_,auVar38,2);
                        if ((bVar82 & (byte)uVar158) == 0) goto LAB_01b390d2;
                        local_420 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                        bVar82 = bVar82 & (byte)uVar158;
                        uVar84 = (ulong)bVar82;
                        auVar156._8_4_ = 0x7f800000;
                        auVar156._0_8_ = 0x7f8000007f800000;
                        auVar156._12_4_ = 0x7f800000;
                        auVar156._16_4_ = 0x7f800000;
                        auVar156._20_4_ = 0x7f800000;
                        auVar156._24_4_ = 0x7f800000;
                        auVar156._28_4_ = 0x7f800000;
                        auVar109 = vblendmps_avx512vl(auVar156,auVar193._0_32_);
                        auVar137._0_4_ =
                             (uint)(bVar82 & 1) * auVar109._0_4_ |
                             (uint)!(bool)(bVar82 & 1) * 0x7f800000;
                        bVar16 = (bool)(bVar82 >> 1 & 1);
                        auVar137._4_4_ = (uint)bVar16 * auVar109._4_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar82 >> 2 & 1);
                        auVar137._8_4_ = (uint)bVar16 * auVar109._8_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar82 >> 3 & 1);
                        auVar137._12_4_ =
                             (uint)bVar16 * auVar109._12_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar82 >> 4 & 1);
                        auVar137._16_4_ =
                             (uint)bVar16 * auVar109._16_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar82 >> 5 & 1);
                        auVar137._20_4_ =
                             (uint)bVar16 * auVar109._20_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar82 >> 6 & 1);
                        auVar137._24_4_ =
                             (uint)bVar16 * auVar109._24_4_ | (uint)!bVar16 * 0x7f800000;
                        auVar137._28_4_ =
                             (uint)(bVar82 >> 7) * auVar109._28_4_ |
                             (uint)!(bool)(bVar82 >> 7) * 0x7f800000;
                        auVar109 = vshufps_avx(auVar137,auVar137,0xb1);
                        auVar109 = vminps_avx(auVar137,auVar109);
                        auVar110 = vshufpd_avx(auVar109,auVar109,5);
                        auVar109 = vminps_avx(auVar109,auVar110);
                        auVar110 = vpermpd_avx2(auVar109,0x4e);
                        auVar109 = vminps_avx(auVar109,auVar110);
                        uVar158 = vcmpps_avx512vl(auVar137,auVar109,0);
                        bVar73 = (byte)uVar158 & bVar82;
                        if (bVar73 != 0) {
                          bVar82 = bVar73;
                        }
                        uVar83 = 0;
                        for (uVar75 = (uint)bVar82; (uVar75 & 1) == 0;
                            uVar75 = uVar75 >> 1 | 0x80000000) {
                          uVar83 = uVar83 + 1;
                        }
                        uVar80 = (ulong)uVar83;
                      } while( true );
                    }
                    fVar163 = local_1e0[uVar80];
                    fVar195 = *(float *)(local_1c0 + uVar80 * 4);
                    fVar208 = 1.0 - fVar163;
                    auVar26._8_4_ = 0x80000000;
                    auVar26._0_8_ = 0x8000000080000000;
                    auVar26._12_4_ = 0x80000000;
                    auVar92 = vxorps_avx512vl(ZEXT416((uint)fVar208),auVar26);
                    auVar88 = ZEXT416((uint)(fVar163 * fVar208 * 4.0));
                    auVar87 = vfnmsub213ss_fma(ZEXT416((uint)fVar163),ZEXT416((uint)fVar163),auVar88
                                              );
                    auVar88 = vfmadd213ss_fma(ZEXT416((uint)fVar208),ZEXT416((uint)fVar208),auVar88)
                    ;
                    fVar208 = fVar208 * auVar92._0_4_ * 0.5;
                    fVar209 = auVar87._0_4_ * 0.5;
                    auVar192 = ZEXT464((uint)fVar209);
                    fVar196 = auVar88._0_4_ * 0.5;
                    fVar174 = fVar163 * fVar163 * 0.5;
                    auVar181._0_4_ = fVar174 * (float)local_4e0._0_4_;
                    auVar181._4_4_ = fVar174 * (float)local_4e0._4_4_;
                    auVar181._8_4_ = fVar174 * (float)uStack_4d8;
                    auVar181._12_4_ = fVar174 * uStack_4d8._4_4_;
                    auVar166._4_4_ = fVar196;
                    auVar166._0_4_ = fVar196;
                    auVar166._8_4_ = fVar196;
                    auVar166._12_4_ = fVar196;
                    auVar88 = vfmadd132ps_fma(auVar166,auVar181,local_4d0);
                    auVar182._4_4_ = fVar209;
                    auVar182._0_4_ = fVar209;
                    auVar182._8_4_ = fVar209;
                    auVar182._12_4_ = fVar209;
                    auVar88 = vfmadd132ps_fma(auVar182,auVar88,local_4c0);
                    auVar191 = ZEXT1664(auVar88);
                    auVar167._4_4_ = fVar208;
                    auVar167._0_4_ = fVar208;
                    auVar167._8_4_ = fVar208;
                    auVar167._12_4_ = fVar208;
                    (ray->super_RayK<1>).tfar = *(float *)(local_1a0 + uVar80 * 4);
                    auVar88 = vfmadd132ps_fma(auVar167,auVar88,local_4b0);
                    uVar158 = vmovlps_avx(auVar88);
                    *(undefined8 *)&(ray->Ng).field_0 = uVar158;
                    fVar208 = (float)vextractps_avx(auVar88,2);
                    (ray->Ng).field_0.field_0.z = fVar208;
                    ray->u = fVar163;
                    ray->v = fVar195;
                    ray->primID = (uint)local_528;
                    ray->geomID = (uint)local_538;
                    ray->instID[0] = context->user->instID[0];
                    ray->instPrimID[0] = context->user->instPrimID[0];
                    lVar78 = local_548;
                  }
                }
              }
            }
          }
        }
        goto LAB_01b38df1;
      }
    }
    fVar163 = (ray->super_RayK<1>).tfar;
    auVar33._4_4_ = fVar163;
    auVar33._0_4_ = fVar163;
    auVar33._8_4_ = fVar163;
    auVar33._12_4_ = fVar163;
    auVar33._16_4_ = fVar163;
    auVar33._20_4_ = fVar163;
    auVar33._24_4_ = fVar163;
    auVar33._28_4_ = fVar163;
    uVar158 = vcmpps_avx512vl(local_80,auVar33,2);
    local_530 = (ulong)((uint)local_530 & (uint)local_530 + 0xff & (uint)uVar158);
  } while( true );
LAB_01b390d2:
  auVar109 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar213 = ZEXT3264(auVar109);
  auVar109 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar214 = ZEXT3264(auVar109);
  auVar215 = ZEXT464(0xbf800000);
  prim = local_520;
  lVar78 = local_548;
LAB_01b38df1:
  lVar76 = lVar76 + 8;
  goto LAB_01b38537;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }